

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_wo_reopen_test(void)

{
  fdb_encryption_key *pfVar1;
  uint64_t *puVar2;
  short *psVar3;
  fdb_status fVar4;
  int iVar5;
  btree *pbVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_kvs_handle *pfVar11;
  size_t sVar12;
  uint64_t extraout_RAX;
  uint64_t uVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_config *config;
  fdb_kvs_info *info_00;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar15;
  size_t sVar16;
  code *__s;
  void *pvVar17;
  fdb_kvs_handle **ppfVar18;
  fdb_kvs_handle *pfVar19;
  char *pcVar20;
  char cVar21;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar22;
  char *pcVar23;
  fdb_file_info *info_01;
  fdb_file_handle *pfVar24;
  fdb_iterator *pfVar25;
  btree *pbVar26;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle [8];
  uint uVar27;
  btree *unaff_R12;
  long lVar28;
  bool *pbVar29;
  fdb_kvs_handle *unaff_R13;
  fdb_config *pfVar30;
  ulong uVar31;
  size_t sVar32;
  fdb_doc **ppfVar33;
  __atomic_base<unsigned_long> _Var34;
  timeval tVar35;
  timeval tVar36;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_new;
  fdb_file_handle *dbfile_new;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info info;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_18b48;
  undefined1 auStack_18b40 [16];
  undefined1 auStack_18b30 [8];
  undefined1 auStack_18b28 [80];
  ulong uStack_18ad8;
  timeval tStack_18ab8;
  fdb_file_info afStack_18aa8 [3];
  fdb_file_info afStack_189a8 [3];
  fdb_config fStack_188a8;
  fdb_kvs_handle *pfStack_187b0;
  fdb_kvs_handle *pfStack_187a8;
  fdb_kvs_handle *pfStack_187a0;
  fdb_config *pfStack_18798;
  fdb_doc **ppfStack_18790;
  fdb_kvs_handle *pfStack_18788;
  fdb_file_handle *pfStack_18778;
  fdb_kvs_handle *pfStack_18770;
  timeval atStack_18768 [2];
  timeval tStack_18748;
  timeval tStack_18738;
  undefined1 auStack_18728 [70];
  undefined1 uStack_186e2;
  undefined8 uStack_186d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18618;
  fdb_kvs_handle *pfStack_18610;
  fdb_kvs_handle *pfStack_18608;
  fdb_kvs_handle *pfStack_18600;
  fdb_doc **ppfStack_185f8;
  fdb_kvs_handle *pfStack_185f0;
  undefined1 auStack_185d8 [16];
  fdb_kvs_handle *pfStack_185c8;
  fdb_kvs_handle *pfStack_185c0;
  fdb_kvs_handle *pfStack_185b8;
  fdb_kvs_handle *pfStack_185b0;
  fdb_kvs_handle *pfStack_185a8;
  fdb_kvs_config fStack_185a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18588;
  filemgr *pfStack_18580;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18578;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18570;
  filemgr *pfStack_18568;
  fdb_kvs_handle *pfStack_18560;
  timeval tStack_18558;
  undefined1 auStack_18548 [256];
  __atomic_base<unsigned_long> _Stack_18448;
  timeval tStack_18440;
  __atomic_base<unsigned_long> _Stack_18430;
  fdb_doc *apfStack_183e8 [32];
  char acStack_182e8 [256];
  char acStack_181e8 [256];
  fdb_kvs_handle afStack_180e8 [153];
  char acStack_4868 [8];
  fdb_kvs_handle *pfStack_4860;
  fdb_kvs_handle *pfStack_4858;
  fdb_kvs_handle *pfStack_4850;
  fdb_kvs_handle *pfStack_4848;
  fdb_doc **ppfStack_4840;
  fdb_kvs_handle *pfStack_4838;
  fdb_kvs_handle *pfStack_4820;
  fdb_kvs_handle *pfStack_4818;
  fdb_doc *pfStack_4810;
  void *pvStack_4808;
  fdb_kvs_config fStack_4800;
  undefined1 auStack_47e8 [48];
  timeval tStack_47b8;
  undefined1 auStack_47a8 [760];
  char acStack_44b0 [256];
  fdb_doc *apfStack_43b0 [101];
  fdb_kvs_handle **ppfStack_4088;
  fdb_kvs_handle *pfStack_4080;
  fdb_kvs_handle *pfStack_4078;
  fdb_kvs_info *pfStack_4070;
  fdb_doc **ppfStack_4068;
  fdb_kvs_handle *pfStack_4060;
  undefined1 auStack_4048 [16];
  undefined1 auStack_4038 [24];
  undefined1 auStack_4020 [32];
  fdb_kvs_handle *apfStack_4000 [5];
  timeval tStack_3fd8;
  char acStack_3fc8 [256];
  fdb_doc *apfStack_3ec8 [31];
  fdb_config fStack_3dd0;
  undefined1 auStack_3cd8 [752];
  undefined8 auStack_39e8 [31];
  fdb_kvs_handle **ppfStack_38f0;
  fdb_kvs_handle *pfStack_38e8;
  fdb_kvs_handle *pfStack_38e0;
  fdb_kvs_config *pfStack_38d8;
  fdb_doc **ppfStack_38d0;
  fdb_kvs_handle *pfStack_38c8;
  fdb_kvs_handle *pfStack_38b0;
  fdb_kvs_handle *pfStack_38a8;
  fdb_doc *pfStack_38a0;
  fdb_kvs_handle *pfStack_3898;
  fdb_doc *apfStack_3890 [11];
  timeval tStack_3838;
  fdb_kvs_config fStack_3828;
  char acStack_3810 [256];
  undefined1 auStack_3710 [656];
  fdb_config fStack_3480;
  fdb_kvs_handle **ppfStack_3388;
  fdb_kvs_handle *pfStack_3380;
  fdb_kvs_handle *pfStack_3378;
  btree *pbStack_3370;
  btree *pbStack_3368;
  fdb_kvs_handle *pfStack_3360;
  fdb_kvs_handle *pfStack_3350;
  fdb_kvs_handle *pfStack_3348;
  fdb_file_handle *pfStack_3340;
  fdb_kvs_handle *pfStack_3338;
  undefined1 auStack_3330 [40];
  undefined1 auStack_3308 [40];
  fdb_file_info fStack_32e0;
  undefined1 auStack_3298 [768];
  char acStack_2f98 [264];
  code *pcStack_2e90;
  fdb_kvs_handle *pfStack_2e88;
  fdb_kvs_handle *pfStack_2e80;
  char *pcStack_2e78;
  long lStack_2e70;
  fdb_kvs_handle *pfStack_2e68;
  fdb_snapshot_info_t *pfStack_2e50;
  fdb_file_handle *pfStack_2e48;
  char *pcStack_2e40;
  int iStack_2e34;
  undefined1 auStack_2e30 [96];
  undefined1 auStack_2dd0 [32];
  timeval tStack_2db0;
  fdb_kvs_handle fStack_2da0;
  char acStack_2b00 [256];
  fdb_config fStack_2a00;
  size_t sStack_2908;
  size_t sStack_2900;
  fdb_doc **ppfStack_28f8;
  char *pcStack_28f0;
  code *pcStack_28e8;
  code *pcStack_28e0;
  fdb_file_handle *pfStack_28c8;
  fdb_snapshot_info_t *pfStack_28c0;
  uint64_t uStack_28b8;
  uint uStack_28ac;
  fdb_kvs_handle *apfStack_28a8 [4];
  fdb_kvs_config fStack_2888;
  char acStack_2870 [8];
  timeval tStack_2868;
  char acStack_2858 [256];
  char acStack_2758 [256];
  char acStack_2658 [264];
  fdb_config fStack_2550;
  fdb_doc *apfStack_2458 [301];
  fdb_kvs_handle **ppfStack_1af0;
  btree *pbStack_1ae8;
  fdb_kvs_handle *pfStack_1ae0;
  fdb_kvs_handle *pfStack_1ad8;
  btree *pbStack_1ad0;
  fdb_kvs_handle *pfStack_1ac8;
  fdb_kvs_handle *pfStack_1ab0;
  fdb_iterator *pfStack_1aa8;
  fdb_kvs_handle *pfStack_1aa0;
  undefined1 auStack_1a98 [16];
  undefined1 auStack_1a88 [40];
  btree bStack_1a60;
  fdb_kvs_info fStack_1a18;
  fdb_config fStack_19e8;
  char acStack_18f0 [256];
  fdb_kvs_handle fStack_17f0;
  fdb_kvs_handle **ppfStack_15e8;
  btree *pbStack_15e0;
  fdb_kvs_handle *pfStack_15d8;
  fdb_kvs_config *pfStack_15d0;
  fdb_file_handle **ppfStack_15c8;
  fdb_kvs_handle *pfStack_15c0;
  fdb_kvs_handle *pfStack_15b0;
  fdb_file_handle *pfStack_15a8;
  fdb_kvs_config fStack_15a0;
  timeval tStack_1588;
  fdb_kvs_info fStack_1578;
  char acStack_1548 [264];
  fdb_config fStack_1440;
  char acStack_1348 [256];
  char acStack_1248 [256];
  fdb_doc *apfStack_1148 [101];
  fdb_kvs_handle **ppfStack_e20;
  btree *pbStack_e18;
  fdb_kvs_handle *pfStack_e10;
  fdb_kvs_handle *pfStack_e08;
  btree *pbStack_e00;
  fdb_kvs_handle *pfStack_df8;
  undefined1 auStack_de0 [16];
  fdb_kvs_handle *pfStack_dd0;
  fdb_kvs_handle *pfStack_dc8;
  btree_kv_ops *pbStack_dc0;
  undefined1 auStack_db8 [40];
  docio_handle *pdStack_d90;
  timeval tStack_d58;
  fdb_config fStack_d48;
  btree abStack_c50 [4];
  btree abStack_b50 [14];
  fdb_kvs_handle fStack_830;
  fdb_kvs_handle **ppfStack_528;
  btree *pbStack_520;
  fdb_kvs_handle *pfStack_518;
  btree *pbStack_510;
  btree *pbStack_508;
  fdb_kvs_handle *pfStack_500;
  fdb_kvs_handle *local_4f0;
  fdb_kvs_handle *local_4e8;
  fdb_file_handle *local_4e0;
  fdb_kvs_handle *local_4d8;
  fdb_file_handle *local_4d0;
  undefined1 auStack_4c8 [32];
  undefined1 local_4a8 [40];
  fdb_file_info local_480;
  char local_438 [264];
  fdb_config local_330;
  fdb_kvs_handle local_238;
  
  pfStack_500 = (fdb_kvs_handle *)0x10c9e7;
  gettimeofday((timeval *)(local_4a8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_500 = (fdb_kvs_handle *)0x10c9ec;
  memleak_start();
  pfStack_500 = (fdb_kvs_handle *)0x10c9f8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_500 = (fdb_kvs_handle *)0x10ca08;
  fdb_get_default_config();
  pbVar6 = (btree *)local_4a8;
  pfStack_500 = (fdb_kvs_handle *)0x10ca15;
  fdb_get_default_kvs_config();
  local_330.buffercache_size = 0x1000000;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_threshold = '\0';
  pbVar26 = (btree *)&local_4e0;
  pfStack_500 = (fdb_kvs_handle *)0x10ca47;
  fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",&local_330);
  ppfVar18 = &local_4e8;
  pfStack_500 = (fdb_kvs_handle *)0x10ca5a;
  fdb_kvs_open_default(local_4e0,ppfVar18,(fdb_kvs_config *)pbVar6);
  pfStack_500 = (fdb_kvs_handle *)0x10ca70;
  fVar4 = fdb_set_log_callback(local_4e8,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_500 = (fdb_kvs_handle *)0x10ca94;
    fdb_open(&local_4d0,"./compact_test1",&local_330);
    ppfVar18 = &local_4d8;
    pfStack_500 = (fdb_kvs_handle *)0x10caa9;
    fdb_kvs_open_default(local_4d0,ppfVar18,(fdb_kvs_config *)local_4a8);
    pfStack_500 = (fdb_kvs_handle *)0x10cabf;
    fVar4 = fdb_set_log_callback(local_4d8,logCallbackFunc,"compact_wo_reopen_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      lVar28 = 0;
      uVar15 = 0;
      do {
        pfVar1 = &local_238.config.encryption_key;
        pfStack_500 = (fdb_kvs_handle *)0x10cae7;
        sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
        pfStack_500 = (fdb_kvs_handle *)0x10caff;
        sprintf((char *)&local_238,"meta%d",uVar15 & 0xffffffff);
        pfStack_500 = (fdb_kvs_handle *)0x10cb17;
        sprintf(local_438,"body%d",uVar15 & 0xffffffff);
        pbVar26 = (btree *)(auStack_4c8 + lVar28);
        pfStack_500 = (fdb_kvs_handle *)0x10cb27;
        unaff_R13 = (fdb_kvs_handle *)strlen((char *)pfVar1);
        unaff_RBP = &local_238;
        pfStack_500 = (fdb_kvs_handle *)0x10cb3a;
        pbVar6 = (btree *)strlen((char *)unaff_RBP);
        pfStack_500 = (fdb_kvs_handle *)0x10cb4a;
        sVar7 = strlen(local_438);
        pfStack_500 = (fdb_kvs_handle *)0x10cb6f;
        fdb_doc_create((fdb_doc **)pbVar26,&local_238.config.encryption_key,(size_t)unaff_R13,
                       unaff_RBP,(size_t)pbVar6,local_438,sVar7);
        pfStack_500 = (fdb_kvs_handle *)0x10cb7e;
        fdb_set(local_4e8,*(fdb_doc **)(auStack_4c8 + uVar15 * 8));
        uVar15 = uVar15 + 1;
        lVar28 = lVar28 + 8;
      } while (uVar15 != 3);
      unaff_R12 = (btree *)0x0;
      ppfVar18 = &local_4f0;
      pfStack_500 = (fdb_kvs_handle *)0x10cbbe;
      fdb_doc_create((fdb_doc **)ppfVar18,
                     *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                      (auStack_4c8._8_8_ + 0x20),
                     (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_4c8._8_8_,
                     *(btree_print_func **)(auStack_4c8._8_8_ + 0x38),
                     (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                              (auStack_4c8._8_8_ + 8),(void *)0x0,0);
      *(undefined1 *)&local_4f0->file = 1;
      pfStack_500 = (fdb_kvs_handle *)0x10cbcf;
      fdb_set(local_4e8,(fdb_doc *)local_4f0);
      pfStack_500 = (fdb_kvs_handle *)0x10cbd7;
      fdb_doc_free((fdb_doc *)local_4f0);
      pfStack_500 = (fdb_kvs_handle *)0x10cbe6;
      fdb_commit(local_4e0,'\x01');
      pfStack_500 = (fdb_kvs_handle *)0x10cbf7;
      fdb_compact(local_4e0,"./compact_test2");
      while( true ) {
        pfStack_500 = (fdb_kvs_handle *)0x10cc1b;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_4c8 + (long)unaff_R12 * 8))[4],
                       **(size_t **)(auStack_4c8 + (long)unaff_R12 * 8),(void *)0x0,0,(void *)0x0,0)
        ;
        pfStack_500 = (fdb_kvs_handle *)0x10cc2a;
        fVar4 = fdb_get(local_4d8,(fdb_doc *)local_4f0);
        pfVar11 = local_4f0;
        if (unaff_R12 != (btree *)0x1) break;
        pfVar11 = unaff_R13;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010cd75;
LAB_0010cc8a:
        pfStack_500 = (fdb_kvs_handle *)0x10cc94;
        fdb_doc_free((fdb_doc *)local_4f0);
        unaff_R12 = (btree *)&unaff_R12->vsize;
        unaff_R13 = pfVar11;
        if (unaff_R12 == (btree *)0x3) {
          pfStack_500 = (fdb_kvs_handle *)0x10ccb3;
          fdb_get_file_info(local_4d0,&local_480);
          pfStack_500 = (fdb_kvs_handle *)0x10ccc2;
          iVar5 = strcmp("./compact_test2",local_480.filename);
          if (iVar5 != 0) {
            pfStack_500 = (fdb_kvs_handle *)0x10ccd0;
            compact_wo_reopen_test();
          }
          lVar28 = 0;
          do {
            pfStack_500 = (fdb_kvs_handle *)0x10ccdc;
            fdb_doc_free(*(fdb_doc **)(auStack_4c8 + lVar28 * 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          pfStack_500 = (fdb_kvs_handle *)0x10ccef;
          fdb_kvs_close(local_4e8);
          pfStack_500 = (fdb_kvs_handle *)0x10ccf9;
          fdb_kvs_close(local_4d8);
          pfStack_500 = (fdb_kvs_handle *)0x10cd03;
          fdb_close(local_4e0);
          pfStack_500 = (fdb_kvs_handle *)0x10cd0d;
          fdb_close(local_4d0);
          pfStack_500 = (fdb_kvs_handle *)0x10cd12;
          fdb_shutdown();
          pfStack_500 = (fdb_kvs_handle *)0x10cd17;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (compact_wo_reopen_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_500 = (fdb_kvs_handle *)0x10cd48;
          fprintf(_stderr,pcVar23,"compaction without reopen test");
          return;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar6 = local_4f0->staletree;
        unaff_RBP = *(fdb_kvs_handle **)(auStack_4c8 + (long)unaff_R12 * 8);
        pbVar26 = unaff_RBP->staletree;
        pfStack_500 = (fdb_kvs_handle *)0x10cc63;
        iVar5 = bcmp(pbVar6,pbVar26,(size_t)(local_4f0->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar6 = (pfVar11->field_6).seqtree;
          pbVar26 = (unaff_RBP->field_6).seqtree;
          pfStack_500 = (fdb_kvs_handle *)0x10cc82;
          iVar5 = bcmp(pbVar6,pbVar26,(size_t)(pfVar11->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010cc8a;
          pfStack_500 = (fdb_kvs_handle *)0x10cd65;
          compact_wo_reopen_test();
          unaff_R13 = pfVar11;
          goto LAB_0010cd65;
        }
      }
      else {
LAB_0010cd65:
        pfVar11 = unaff_R13;
        pfStack_500 = (fdb_kvs_handle *)0x10cd6a;
        compact_wo_reopen_test();
      }
      pfStack_500 = (fdb_kvs_handle *)0x10cd75;
      compact_wo_reopen_test();
      unaff_R13 = pfVar11;
LAB_0010cd75:
      pfStack_500 = (fdb_kvs_handle *)0x10cd7a;
      compact_wo_reopen_test();
      goto LAB_0010cd7a;
    }
  }
  else {
LAB_0010cd7a:
    pfStack_500 = (fdb_kvs_handle *)0x10cd7f;
    compact_wo_reopen_test();
  }
  pfStack_500 = (fdb_kvs_handle *)compact_with_reopen_test;
  compact_wo_reopen_test();
  pfStack_df8 = (fdb_kvs_handle *)0x10cda4;
  ppfStack_528 = ppfVar18;
  pbStack_520 = unaff_R12;
  pfStack_518 = unaff_R13;
  pbStack_510 = pbVar6;
  pbStack_508 = pbVar26;
  pfStack_500 = unaff_RBP;
  gettimeofday(&tStack_d58,(__timezone_ptr_t)0x0);
  pfStack_df8 = (fdb_kvs_handle *)0x10cda9;
  memleak_start();
  pfStack_df8 = (fdb_kvs_handle *)0x10cdb5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_df8 = (fdb_kvs_handle *)0x10cdc5;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_db8;
  pfStack_df8 = (fdb_kvs_handle *)0x10cdd2;
  fdb_get_default_kvs_config();
  fStack_d48.buffercache_size = 0x1000000;
  fStack_d48.wal_threshold = 0x400;
  fStack_d48.flags = 1;
  fStack_d48.compaction_threshold = '\0';
  pbVar6 = (btree *)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10ce04;
  fdb_open((fdb_file_handle **)pbVar6,"./compact_test1",&fStack_d48);
  ppfVar18 = (fdb_kvs_handle **)(auStack_de0 + 8);
  pfStack_df8 = (fdb_kvs_handle *)0x10ce17;
  fdb_kvs_open_default((fdb_file_handle *)auStack_de0._0_8_,ppfVar18,(fdb_kvs_config *)pfVar11);
  pfStack_df8 = (fdb_kvs_handle *)0x10ce2d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5d7;
  unaff_R12 = (btree *)0x0;
  uVar15 = 0;
  do {
    pfVar1 = &fStack_830.config.encryption_key;
    pfStack_df8 = (fdb_kvs_handle *)0x10ce55;
    sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
    pfStack_df8 = (fdb_kvs_handle *)0x10ce6d;
    sprintf((char *)&fStack_830,"meta%d",uVar15 & 0xffffffff);
    pfStack_df8 = (fdb_kvs_handle *)0x10ce85;
    sprintf((char *)abStack_c50,"body%d",uVar15 & 0xffffffff);
    pbVar6 = (btree *)(&abStack_b50[0].ksize + (long)unaff_R12);
    pfStack_df8 = (fdb_kvs_handle *)0x10ce98;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar1);
    unaff_RBP = &fStack_830;
    pfStack_df8 = (fdb_kvs_handle *)0x10ceab;
    sVar7 = strlen((char *)unaff_RBP);
    pfStack_df8 = (fdb_kvs_handle *)0x10cebb;
    sVar9 = strlen((char *)abStack_c50);
    pfStack_df8 = (fdb_kvs_handle *)0x10cee0;
    fdb_doc_create((fdb_doc **)pbVar6,&fStack_830.config.encryption_key,(size_t)pfVar8,unaff_RBP,
                   sVar7,abStack_c50,sVar9);
    pfStack_df8 = (fdb_kvs_handle *)0x10cef2;
    fdb_set((fdb_kvs_handle *)auStack_de0._8_8_,*(fdb_doc **)(&abStack_b50[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    unaff_R12 = (btree *)((long)unaff_R12 + 8);
  } while (uVar15 != 100);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf32;
  fdb_doc_create((fdb_doc **)&pfStack_dd0,*(void **)(abStack_b50[0].root_bid + 0x20),
                 *(size_t *)abStack_b50[0].root_bid,*(void **)(abStack_b50[0].root_bid + 0x38),
                 *(size_t *)(abStack_b50[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&pfStack_dd0->file = 1;
  ppfVar18 = (fdb_kvs_handle **)(auStack_de0 + 8);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf46;
  fdb_set((fdb_kvs_handle *)auStack_de0._8_8_,(fdb_doc *)pfStack_dd0);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf4e;
  fdb_doc_free((fdb_doc *)pfStack_dd0);
  pfVar11 = (fdb_kvs_handle *)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10cf60;
  fdb_commit((fdb_file_handle *)auStack_de0._0_8_,'\x01');
  pfStack_df8 = (fdb_kvs_handle *)0x10cf6f;
  fdb_compact((fdb_file_handle *)auStack_de0._0_8_,"./compact_test2");
  pfStack_df8 = (fdb_kvs_handle *)0x10cf77;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf7f;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10cf8b;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_df8 = (fdb_kvs_handle *)0x10cfa2;
  fdb_open((fdb_file_handle **)pfVar11,"./compact_test1",&fStack_d48);
  pfStack_df8 = (fdb_kvs_handle *)0x10cfb2;
  fdb_kvs_open_default((fdb_file_handle *)auStack_de0._0_8_,ppfVar18,(fdb_kvs_config *)auStack_db8);
  pfStack_df8 = (fdb_kvs_handle *)0x10cfc8;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5dc;
  unaff_R12 = (btree *)0x0;
  unaff_R13 = pfVar8;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10cfff;
    fdb_doc_create((fdb_doc **)&pfStack_dd0,
                   (void *)(*(size_t **)(&abStack_b50[0].ksize + (long)unaff_R12 * 8))[4],
                   **(size_t **)(&abStack_b50[0].ksize + (long)unaff_R12 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_df8 = (fdb_kvs_handle *)0x10d00e;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_de0._8_8_,(fdb_doc *)pfStack_dd0);
    pfVar8 = pfStack_dd0;
    if (unaff_R12 == (btree *)0x1) {
      pfVar8 = unaff_R13;
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d5d2;
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5c2;
      pfVar11 = (fdb_kvs_handle *)pfStack_dd0->staletree;
      unaff_RBP = *(fdb_kvs_handle **)(&abStack_b50[0].ksize + (long)unaff_R12 * 8);
      pbVar6 = unaff_RBP->staletree;
      pfStack_df8 = (fdb_kvs_handle *)0x10d04a;
      iVar5 = bcmp(pfVar11,pbVar6,(size_t)(pfStack_dd0->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010d5c7;
      pfVar11 = (fdb_kvs_handle *)(pfVar8->field_6).seqtree;
      pbVar6 = (unaff_RBP->field_6).seqtree;
      pfStack_df8 = (fdb_kvs_handle *)0x10d069;
      iVar5 = bcmp(pfVar11,pbVar6,(size_t)(pfVar8->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010d5b7;
    }
    pfStack_df8 = (fdb_kvs_handle *)0x10d07b;
    fdb_doc_free((fdb_doc *)pfStack_dd0);
    unaff_R12 = (btree *)&unaff_R12->vsize;
    unaff_R13 = pfVar8;
  } while (unaff_R12 != (btree *)0x64);
  pfStack_df8 = (fdb_kvs_handle *)0x10d09a;
  fdb_get_file_info((fdb_file_handle *)auStack_de0._0_8_,(fdb_file_info *)(auStack_db8 + 0x18));
  pfStack_df8 = (fdb_kvs_handle *)0x10d0a9;
  iVar5 = strcmp("./compact_test1",(char *)auStack_db8._24_8_);
  if (iVar5 != 0) {
    pfStack_df8 = (fdb_kvs_handle *)0x10d0b7;
    compact_with_reopen_test();
  }
  pfVar11 = &fStack_830;
  unaff_R12 = abStack_c50;
  pfVar8 = (fdb_kvs_handle *)0x0;
  uVar15 = 0;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d0df;
    sprintf((char *)pfVar11,"newmeta%d",uVar15 & 0xffffffff);
    pfStack_df8 = (fdb_kvs_handle *)0x10d0fa;
    sprintf((char *)unaff_R12,"newbody%d_%s",uVar15 & 0xffffffff,&fStack_830.bub_ctx.handle);
    pfStack_df8 = (fdb_kvs_handle *)0x10d10d;
    pbVar6 = (btree *)strlen((char *)pfVar11);
    pfStack_df8 = (fdb_kvs_handle *)0x10d118;
    sVar7 = strlen((char *)unaff_R12);
    pfStack_df8 = (fdb_kvs_handle *)0x10d12c;
    fdb_doc_update((fdb_doc **)(&abStack_b50[0].ksize + (long)pfVar8),pfVar11,(size_t)pbVar6,
                   unaff_R12,sVar7);
    pfStack_df8 = (fdb_kvs_handle *)0x10d13e;
    fdb_set((fdb_kvs_handle *)auStack_de0._8_8_,*(fdb_doc **)(&abStack_b50[0].ksize + uVar15 * 8));
    uVar15 = uVar15 + 1;
    pfVar8 = (fdb_kvs_handle *)((long)pfVar8 + 8);
  } while (uVar15 != 100);
  pfStack_df8 = (fdb_kvs_handle *)0x10d167;
  fdb_open((fdb_file_handle **)&pbStack_dc0,"./compact_test1",&fStack_d48);
  ppfVar18 = &pfStack_dc8;
  pfStack_df8 = (fdb_kvs_handle *)0x10d17c;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_dc0,ppfVar18,(fdb_kvs_config *)auStack_db8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d192;
  fVar4 = fdb_set_log_callback(pfStack_dc8,logCallbackFunc,"compact_with_reopen_test");
  unaff_RBP = (fdb_kvs_handle *)0x64;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e1;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1a6;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e6;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1ba;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5eb;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1ce;
  fVar4 = fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5f0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d1e0;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d1ea;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfVar8 = (fdb_kvs_handle *)0x0;
  ppfVar18 = &pfStack_dd0;
  pfVar14 = pfVar11;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d219;
    fdb_doc_create((fdb_doc **)ppfVar18,
                   (void *)(*(size_t **)(&abStack_b50[0].ksize + (long)pfVar8 * 8))[4],
                   **(size_t **)(&abStack_b50[0].ksize + (long)pfVar8 * 8),(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_df8 = (fdb_kvs_handle *)0x10d228;
    fVar4 = fdb_get(pfStack_dc8,(fdb_doc *)pfStack_dd0);
    pfVar11 = pfStack_dd0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_df8 = (fdb_kvs_handle *)0x10d586;
      compact_with_reopen_test();
LAB_0010d586:
      pfStack_df8 = (fdb_kvs_handle *)0x10d591;
      compact_with_reopen_test();
LAB_0010d591:
      pfStack_df8 = (fdb_kvs_handle *)0x10d59c;
      compact_with_reopen_test();
      goto LAB_0010d59c;
    }
    pbVar6 = pfStack_dd0->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_b50[0].ksize + (long)pfVar8 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d254;
    iVar5 = bcmp(pbVar6,unaff_R12,(size_t)(pfStack_dd0->kvs_config).custom_cmp);
    pfVar14 = pfVar11;
    if (iVar5 != 0) goto LAB_0010d586;
    pbVar6 = (pfVar11->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d273;
    iVar5 = bcmp(pbVar6,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d591;
    pfStack_df8 = (fdb_kvs_handle *)0x10d283;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x64);
  pfStack_df8 = (fdb_kvs_handle *)0x10d2a9;
  fVar4 = fdb_open((fdb_file_handle **)auStack_de0,"./compact_test1",&fStack_d48);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5f5;
  pfStack_df8 = (fdb_kvs_handle *)0x10d2c5;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_de0._0_8_,(fdb_kvs_handle **)(auStack_de0 + 8),
                     (fdb_kvs_config *)auStack_db8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5fa;
  pfStack_df8 = (fdb_kvs_handle *)0x10d2e5;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5ff;
  pfStack_df8 = (fdb_kvs_handle *)0x10d2ff;
  fdb_get_file_info((fdb_file_handle *)auStack_de0._0_8_,(fdb_file_info *)(auStack_db8 + 0x18));
  pfStack_df8 = (fdb_kvs_handle *)0x10d30e;
  iVar5 = strcmp("./compact_test1.3",(char *)auStack_db8._24_8_);
  if (iVar5 != 0) {
    pfStack_df8 = (fdb_kvs_handle *)0x10d31c;
    compact_with_reopen_test();
  }
  pfStack_df8 = (fdb_kvs_handle *)0x10d326;
  fdb_kvs_close(pfStack_dc8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d330;
  fdb_close((fdb_file_handle *)pbStack_dc0);
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_df8 = (fdb_kvs_handle *)0x10d35f;
    fdb_doc_create((fdb_doc **)&pfStack_dd0,
                   (void *)(*(size_t **)(&abStack_b50[0].ksize + (long)pfVar8 * 8))[4],
                   **(size_t **)(&abStack_b50[0].ksize + (long)pfVar8 * 8),(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_df8 = (fdb_kvs_handle *)0x10d36e;
    fVar4 = fdb_get((fdb_kvs_handle *)auStack_de0._8_8_,(fdb_doc *)pfStack_dd0);
    pfVar11 = pfStack_dd0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d59c;
    pbVar6 = pfStack_dd0->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_b50[0].ksize + (long)pfVar8 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d39a;
    iVar5 = bcmp(pbVar6,unaff_R12,(size_t)(pfStack_dd0->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0010d5a1;
    pbVar6 = (pfVar11->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_df8 = (fdb_kvs_handle *)0x10d3b9;
    iVar5 = bcmp(pbVar6,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5ac;
    pfStack_df8 = (fdb_kvs_handle *)0x10d3c9;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
    pfVar14 = pfVar11;
  } while (pfVar8 != (fdb_kvs_handle *)0x64);
  ppfVar18 = (fdb_kvs_handle **)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d3e5;
  fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  pfVar11 = (fdb_kvs_handle *)(auStack_de0 + 8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d3f2;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d3fa;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d406;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_df8 = (fdb_kvs_handle *)0x10d41d;
  fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&fStack_d48);
  pfStack_df8 = (fdb_kvs_handle *)0x10d42d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_de0._0_8_,(fdb_kvs_handle **)pfVar11,
             (fdb_kvs_config *)auStack_db8);
  pfStack_df8 = (fdb_kvs_handle *)0x10d443;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d604;
  ppfVar18 = (fdb_kvs_handle **)auStack_de0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d45a;
  fdb_compact((fdb_file_handle *)auStack_de0._0_8_,(char *)0x0);
  pfStack_df8 = (fdb_kvs_handle *)0x10d464;
  fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d46c;
  fdb_close((fdb_file_handle *)auStack_de0._0_8_);
  pfStack_df8 = (fdb_kvs_handle *)0x10d483;
  fVar4 = fdb_open((fdb_file_handle **)ppfVar18,"./compact_test.fdb",&fStack_d48);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d609;
  pfStack_df8 = (fdb_kvs_handle *)0x10d49f;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_de0._0_8_,(fdb_kvs_handle **)(auStack_de0 + 8),
                     (fdb_kvs_config *)auStack_db8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d60e;
  pfStack_df8 = (fdb_kvs_handle *)0x10d4bf;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_de0._8_8_,logCallbackFunc,"compact_with_reopen_test")
  ;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_df8 = (fdb_kvs_handle *)0x10d4d9;
    fdb_get_file_info((fdb_file_handle *)auStack_de0._0_8_,(fdb_file_info *)(auStack_db8 + 0x18));
    pfStack_df8 = (fdb_kvs_handle *)0x10d4e8;
    iVar5 = strcmp("./compact_test.fdb",(char *)auStack_db8._24_8_);
    if (iVar5 != 0) {
      pfStack_df8 = (fdb_kvs_handle *)0x10d4f6;
      compact_with_reopen_test();
    }
    if (pdStack_d90 != (docio_handle *)0x64) {
      pfStack_df8 = (fdb_kvs_handle *)0x10d508;
      compact_with_reopen_test();
    }
    lVar28 = 0;
    do {
      pfStack_df8 = (fdb_kvs_handle *)0x10d517;
      fdb_doc_free(*(fdb_doc **)(&abStack_b50[0].ksize + lVar28 * 8));
      lVar28 = lVar28 + 1;
    } while (lVar28 != 100);
    pfStack_df8 = (fdb_kvs_handle *)0x10d52a;
    fdb_kvs_close((fdb_kvs_handle *)auStack_de0._8_8_);
    pfStack_df8 = (fdb_kvs_handle *)0x10d534;
    fdb_close((fdb_file_handle *)auStack_de0._0_8_);
    pfStack_df8 = (fdb_kvs_handle *)0x10d539;
    fdb_shutdown();
    pfStack_df8 = (fdb_kvs_handle *)0x10d53e;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_df8 = (fdb_kvs_handle *)0x10d56f;
    fprintf(_stderr,pcVar23,"compaction with reopen test");
    return;
  }
  goto LAB_0010d613;
LAB_0010eacf:
  pfStack_2e68 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
  goto LAB_0010ead4;
LAB_001107eb:
  pfStack_185f0 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar11 = pfVar22;
LAB_001107f6:
  pfVar22 = pfVar11;
  pfStack_185f0 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_185f0 = (fdb_kvs_handle *)0x110806;
  pcVar23 = (char *)pfVar14;
  compaction_daemon_test();
  pfVar11 = pfVar22;
LAB_00110806:
  _Var34._M_i = (__int_type_conflict)apfStack_183e8;
  pcVar20 = "key%04d";
  pfStack_185f0 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_0010d59c:
  pfVar11 = pfVar14;
  pfStack_df8 = (fdb_kvs_handle *)0x10d5a1;
  compact_with_reopen_test();
LAB_0010d5a1:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5ac;
  compact_with_reopen_test();
LAB_0010d5ac:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5b7;
  compact_with_reopen_test();
LAB_0010d5b7:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5c2;
  compact_with_reopen_test();
  unaff_R13 = pfVar8;
LAB_0010d5c2:
  pfVar8 = unaff_R13;
  pfStack_df8 = (fdb_kvs_handle *)0x10d5c7;
  compact_with_reopen_test();
LAB_0010d5c7:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5d2;
  compact_with_reopen_test();
  unaff_R13 = pfVar8;
LAB_0010d5d2:
  ppfVar18 = &pfStack_dd0;
  pfStack_df8 = (fdb_kvs_handle *)0x10d5d7;
  compact_with_reopen_test();
LAB_0010d5d7:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5dc;
  compact_with_reopen_test();
  pfVar8 = unaff_R13;
LAB_0010d5dc:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5e1;
  compact_with_reopen_test();
LAB_0010d5e1:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5e6;
  compact_with_reopen_test();
LAB_0010d5e6:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5eb;
  compact_with_reopen_test();
LAB_0010d5eb:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5f5;
  compact_with_reopen_test();
LAB_0010d5f5:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5fa;
  compact_with_reopen_test();
LAB_0010d5fa:
  pfStack_df8 = (fdb_kvs_handle *)0x10d5ff;
  compact_with_reopen_test();
LAB_0010d5ff:
  pfStack_df8 = (fdb_kvs_handle *)0x10d604;
  compact_with_reopen_test();
LAB_0010d604:
  pfStack_df8 = (fdb_kvs_handle *)0x10d609;
  compact_with_reopen_test();
LAB_0010d609:
  pfStack_df8 = (fdb_kvs_handle *)0x10d60e;
  compact_with_reopen_test();
LAB_0010d60e:
  pfStack_df8 = (fdb_kvs_handle *)0x10d613;
  compact_with_reopen_test();
LAB_0010d613:
  pfStack_df8 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_15c0 = (fdb_kvs_handle *)0x10d635;
  ppfStack_e20 = ppfVar18;
  pbStack_e18 = unaff_R12;
  pfStack_e10 = pfVar8;
  pfStack_e08 = pfVar11;
  pbStack_e00 = pbVar6;
  pfStack_df8 = unaff_RBP;
  gettimeofday(&tStack_1588,(__timezone_ptr_t)0x0);
  pfStack_15c0 = (fdb_kvs_handle *)0x10d63a;
  memleak_start();
  pfStack_15c0 = (fdb_kvs_handle *)0x10d646;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15c0 = (fdb_kvs_handle *)0x10d656;
  fdb_get_default_config();
  pfStack_15c0 = (fdb_kvs_handle *)0x10d663;
  fdb_get_default_kvs_config();
  fStack_1440.wal_threshold = 0x400;
  fStack_1440.flags = 1;
  fStack_1440.compaction_threshold = '\0';
  pfStack_15c0 = (fdb_kvs_handle *)0x10d68d;
  fdb_open(&pfStack_15a8,"./compact_test1",&fStack_1440);
  pfStack_15c0 = (fdb_kvs_handle *)0x10d6a7;
  fdb_kvs_open(pfStack_15a8,&pfStack_15b0,"db",&fStack_15a0);
  pfStack_15c0 = (fdb_kvs_handle *)0x10d6bd;
  fVar4 = fdb_set_log_callback(pfStack_15b0,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar15 = 0;
    do {
      pfStack_15c0 = (fdb_kvs_handle *)0x10d6e5;
      sprintf(acStack_1248,"key%d",uVar15 & 0xffffffff);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d6fd;
      sprintf(acStack_1348,"meta%d",uVar15 & 0xffffffff);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d712;
      sprintf(acStack_1548,"body%d",uVar15 & 0xffffffff);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d725;
      sVar7 = strlen(acStack_1248);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d738;
      sVar9 = strlen(acStack_1348);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d745;
      sVar10 = strlen(acStack_1548);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d767;
      fdb_doc_create((fdb_doc **)((long)apfStack_1148 + lVar28),acStack_1248,sVar7,acStack_1348,
                     sVar9,acStack_1548,sVar10);
      pfStack_15c0 = (fdb_kvs_handle *)0x10d779;
      fdb_set(pfStack_15b0,apfStack_1148[uVar15]);
      uVar15 = uVar15 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar15 != 100);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d799;
    fdb_commit(pfStack_15a8,'\0');
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7a3;
    fdb_compact(pfStack_15a8,(char *)0x0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7b9;
    fdb_get_kvs_info(pfStack_15b0,&fStack_1578);
    lVar28 = (long)(int)fStack_1578.doc_count;
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7c6;
    fdb_kvs_close(pfStack_15b0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7ce;
    fdb_close(pfStack_15a8);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7e5;
    fdb_open(&pfStack_15a8,"./compact_test1",&fStack_1440);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d7fc;
    fdb_kvs_open(pfStack_15a8,&pfStack_15b0,"db",&fStack_15a0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d808;
    fdb_get_kvs_info(pfStack_15b0,&fStack_1578);
    if (lVar28 != CONCAT44(fStack_1578.doc_count._4_4_,(int)fStack_1578.doc_count)) {
      pfStack_15c0 = (fdb_kvs_handle *)0x10d81b;
      compact_reopen_named_kvs();
    }
    pfStack_15c0 = (fdb_kvs_handle *)0x10d825;
    fdb_kvs_close(pfStack_15b0);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d82f;
    fdb_close(pfStack_15a8);
    lVar28 = 0;
    do {
      pfStack_15c0 = (fdb_kvs_handle *)0x10d83e;
      fdb_doc_free(apfStack_1148[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 100);
    pfStack_15c0 = (fdb_kvs_handle *)0x10d84c;
    fdb_shutdown();
    pfStack_15c0 = (fdb_kvs_handle *)0x10d851;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_15c0 = (fdb_kvs_handle *)0x10d882;
    fprintf(_stderr,pcVar23,"compact reopen named kvs");
    return;
  }
  pfStack_15c0 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8b6;
  ppfStack_15e8 = &pfStack_15b0;
  pbStack_15e0 = unaff_R12;
  pfStack_15d8 = pfVar8;
  pfStack_15d0 = &fStack_15a0;
  ppfStack_15c8 = &pfStack_15a8;
  pfStack_15c0 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1a88 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8bb;
  memleak_start();
  pfStack_1aa0 = (fdb_kvs_handle *)0x0;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8d0;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8e0;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_1a88;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d8ed;
  fdb_get_default_kvs_config();
  fStack_19e8.wal_threshold = 0x400;
  fStack_19e8.flags = 1;
  fStack_19e8.compaction_threshold = '\0';
  pbVar6 = (btree *)auStack_1a98;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d917;
  fdb_open((fdb_file_handle **)pbVar6,"./compact_test1",&fStack_19e8);
  ppfVar18 = &pfStack_1ab0;
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d931;
  fdb_kvs_open((fdb_file_handle *)auStack_1a98._0_8_,ppfVar18,"db",(fdb_kvs_config *)pfVar11);
  pfStack_1ac8 = (fdb_kvs_handle *)0x10d947;
  pfVar14 = pfStack_1ab0;
  fVar4 = fdb_set_log_callback(pfStack_1ab0,logCallbackFunc,"compact_reopen_with_iterator");
  uVar27 = (uint)pfVar14;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (btree *)0x0;
    uVar15 = 0;
    do {
      pfVar1 = &fStack_17f0.config.encryption_key;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d96f;
      sprintf((char *)pfVar1,"key%d",uVar15 & 0xffffffff);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d987;
      sprintf((char *)&fStack_17f0,"meta%d",uVar15 & 0xffffffff);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d99f;
      sprintf(acStack_18f0,"body%d",uVar15 & 0xffffffff);
      pbVar6 = (btree *)(&bStack_1a60.ksize + (long)unaff_R12);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9af;
      pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar1);
      unaff_RBP = &fStack_17f0;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9c2;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9d2;
      sVar7 = strlen(acStack_18f0);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10d9f7;
      fdb_doc_create((fdb_doc **)pbVar6,&fStack_17f0.config.encryption_key,(size_t)pfVar8,unaff_RBP,
                     (size_t)pfVar11,acStack_18f0,sVar7);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10da06;
      fdb_set(pfStack_1ab0,*(fdb_doc **)(&bStack_1a60.ksize + uVar15 * 8));
      uVar15 = uVar15 + 1;
      unaff_R12 = (btree *)((long)unaff_R12 + 8);
    } while (uVar15 != 9);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da23;
    fdb_commit((fdb_file_handle *)auStack_1a98._0_8_,'\0');
    ppfVar18 = (fdb_kvs_handle **)(auStack_1a98 + 8);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da3f;
    fdb_open((fdb_file_handle **)ppfVar18,"./compact_test1",&fStack_19e8);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da4e;
    pfVar24 = (fdb_file_handle *)auStack_1a98._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_1a98._8_8_,"./compact_test2");
    uVar27 = (uint)pfVar24;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dc71;
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da60;
    fdb_close((fdb_file_handle *)auStack_1a98._8_8_);
    pfStack_1ac8 = (fdb_kvs_handle *)0x10da80;
    pfVar14 = pfStack_1ab0;
    fVar4 = fdb_iterator_init(pfStack_1ab0,&pfStack_1aa8,(void *)0x0,0,(void *)0x0,0,0);
    uVar27 = (uint)pfVar14;
    pfVar14 = pfVar11;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dc76;
    pfVar8 = (fdb_kvs_handle *)0x0;
    ppfVar18 = &pfStack_1aa0;
    do {
      pfStack_1ac8 = (fdb_kvs_handle *)0x10da9d;
      fVar4 = fdb_iterator_get(pfStack_1aa8,(fdb_doc **)ppfVar18);
      pfVar14 = pfStack_1aa0;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0010dc51:
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc56;
        compact_reopen_with_iterator();
LAB_0010dc56:
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc61;
        compact_reopen_with_iterator();
LAB_0010dc61:
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc6c;
        pbVar26 = unaff_R12;
        compact_reopen_with_iterator();
        uVar27 = (uint)pbVar26;
        goto LAB_0010dc6c;
      }
      pbVar6 = (btree *)pfStack_1aa0->op_stats;
      unaff_RBP = *(fdb_kvs_handle **)(&bStack_1a60.ksize + (long)pfVar8 * 8);
      unaff_R12 = (btree *)unaff_RBP->op_stats;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dac5;
      iVar5 = bcmp(pbVar6,unaff_R12,*(size_t *)&pfStack_1aa0->kvs_config);
      pfVar11 = pfVar14;
      if (iVar5 != 0) {
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dc51;
        compact_reopen_with_iterator();
        goto LAB_0010dc51;
      }
      pbVar6 = pfVar14->staletree;
      unaff_R12 = unaff_RBP->staletree;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dae4;
      iVar5 = bcmp(pbVar6,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010dc61;
      pbVar6 = (pfVar14->field_6).seqtree;
      unaff_R12 = (unaff_RBP->field_6).seqtree;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db03;
      iVar5 = bcmp(pbVar6,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010dc56;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db13;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_1aa0 = (fdb_kvs_handle *)0x0;
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db29;
      pfVar25 = pfStack_1aa8;
      fVar4 = fdb_iterator_next(pfStack_1aa8);
      uVar27 = (uint)pfVar25;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)pfVar8 != 9) goto LAB_0010dc7b;
    pfStack_1ac8 = (fdb_kvs_handle *)0x10db46;
    fVar4 = fdb_iterator_close(pfStack_1aa8);
    uVar27 = (uint)pfStack_1aa8;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db66;
      fdb_get_kvs_info(pfStack_1ab0,&fStack_1a18);
      lVar28 = (long)(int)fStack_1a18.doc_count;
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db72;
      fdb_kvs_close(pfStack_1ab0);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db80;
      fdb_close((fdb_file_handle *)auStack_1a98._0_8_);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10db97;
      fdb_open((fdb_file_handle **)auStack_1a98,"./compact_test2",&fStack_19e8);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbaf;
      fdb_kvs_open((fdb_file_handle *)auStack_1a98._0_8_,&pfStack_1ab0,"db",
                   (fdb_kvs_config *)auStack_1a88);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbba;
      fdb_get_kvs_info(pfStack_1ab0,&fStack_1a18);
      if (lVar28 != CONCAT44(fStack_1a18.doc_count._4_4_,(int)fStack_1a18.doc_count)) {
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dbd0;
        compact_reopen_with_iterator();
      }
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbda;
      fdb_kvs_close(pfStack_1ab0);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbe4;
      fdb_close((fdb_file_handle *)auStack_1a98._0_8_);
      lVar28 = 0;
      do {
        pfStack_1ac8 = (fdb_kvs_handle *)0x10dbf0;
        fdb_doc_free(*(fdb_doc **)(&bStack_1a60.ksize + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 9);
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dbfe;
      fdb_shutdown();
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc03;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_1ac8 = (fdb_kvs_handle *)0x10dc34;
      fprintf(_stderr,pcVar23,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dc6c:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dc71;
    compact_reopen_with_iterator();
LAB_0010dc71:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dc76;
    compact_reopen_with_iterator();
    pfVar14 = pfVar11;
LAB_0010dc76:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dc7b;
    compact_reopen_with_iterator();
LAB_0010dc7b:
    pfStack_1ac8 = (fdb_kvs_handle *)0x10dc80;
    compact_reopen_with_iterator();
  }
  pfStack_1ac8 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_28e0 = (code *)0x10dca7;
  ppfStack_1af0 = ppfVar18;
  pbStack_1ae8 = unaff_R12;
  pfStack_1ae0 = pfVar8;
  pfStack_1ad8 = pfVar14;
  pbStack_1ad0 = pbVar6;
  pfStack_1ac8 = unaff_RBP;
  gettimeofday(&tStack_2868,(__timezone_ptr_t)0x0);
  pcStack_28e0 = (code *)0x10dcac;
  memleak_start();
  pcStack_28e0 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_28e0 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  fStack_2550.buffercache_size = 0;
  fStack_2550.wal_threshold = 0x32;
  fStack_2550.flags = 1;
  fStack_2550.compaction_threshold = '\0';
  fStack_2550.block_reusing_threshold = 0;
  pcStack_28e0 = (code *)0x10dcf4;
  fStack_2550.multi_kv_instances = (bool)(char)uVar27;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_28e0 = (code *)0x10dd08;
  fdb_open(&pfStack_28c8,"./compact_test1",&fStack_2550);
  uStack_28ac = uVar27;
  if (uVar27 == 0) {
    pcStack_28e0 = (code *)0x10dd74;
    fdb_kvs_open_default(pfStack_28c8,apfStack_28a8,&fStack_2888);
    sVar16 = 1;
  }
  else {
    ppfVar18 = apfStack_28a8;
    uVar15 = 0;
    do {
      pcStack_28e0 = (code *)0x10dd39;
      sprintf(acStack_2870,"kv%d",uVar15 & 0xffffffff);
      pcStack_28e0 = (code *)0x10dd4c;
      fdb_kvs_open(pfStack_28c8,ppfVar18,acStack_2870,&fStack_2888);
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    sVar16 = 4;
  }
  uVar15 = 0;
  do {
    pcStack_28e0 = (code *)0x10dd98;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10ddb1;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10ddca;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10dddd;
    sVar7 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10ddf0;
    sVar9 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10de00;
    sVar10 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10de25;
    fdb_doc_create(apfStack_2458 + uVar15,acStack_2658,sVar7,acStack_2758,sVar9,acStack_2858,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10de36;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x4b);
  pcStack_28e0 = (code *)0x10de5a;
  fdb_commit(pfStack_28c8,'\x01');
  uVar15 = 0x4b;
  do {
    pcStack_28e0 = (code *)0x10de7c;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10de95;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10deae;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10dec1;
    sVar7 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10ded4;
    sVar9 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10dee4;
    sVar10 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10df09;
    fdb_doc_create(apfStack_2458 + uVar15,acStack_2658,sVar7,acStack_2758,sVar9,acStack_2858,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10df1a;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x96);
  lVar28 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10df4a;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[lVar28]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x4b);
  lVar28 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10df73;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[lVar28]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x4b);
  pcStack_28e0 = (code *)0x10df90;
  fdb_commit(pfStack_28c8,'\0');
  uVar15 = 0x96;
  do {
    pcStack_28e0 = (code *)0x10dfb2;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10dfcb;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10dfe4;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10dff7;
    sVar7 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10e00a;
    sVar9 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10e01a;
    sVar10 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10e03f;
    fdb_doc_create(apfStack_2458 + uVar15,acStack_2658,sVar7,acStack_2758,sVar9,acStack_2858,sVar10)
    ;
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10e050;
      fdb_set(apfStack_28a8[sVar32],apfStack_2458[uVar15]);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xe1);
  pcStack_28e0 = (code *)0x10e077;
  fdb_commit(pfStack_28c8,'\x01');
  uVar15 = 0xe1;
  do {
    pcStack_28e0 = (code *)0x10e099;
    sprintf(acStack_2658,"key%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e0b2;
    sprintf(acStack_2758,"meta%d",uVar15 & 0xffffffff);
    pcStack_28e0 = (code *)0x10e0cb;
    sprintf(acStack_2858,"body%d",uVar15 & 0xffffffff);
    ppfVar33 = apfStack_2458 + uVar15;
    pcStack_28e0 = (code *)0x10e0de;
    sVar7 = strlen(acStack_2658);
    pcStack_28e0 = (code *)0x10e0f1;
    sVar9 = strlen(acStack_2758);
    pcStack_28e0 = (code *)0x10e101;
    sVar10 = strlen(acStack_2858);
    pcStack_28e0 = (code *)0x10e126;
    fdb_doc_create(ppfVar33,acStack_2658,sVar7,acStack_2758,sVar9,acStack_2858,sVar10);
    sVar32 = 0;
    do {
      pcStack_28e0 = (code *)0x10e137;
      fdb_set(apfStack_28a8[sVar32],*ppfVar33);
      sVar32 = sVar32 + 1;
    } while (sVar16 != sVar32);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 300);
  sVar32 = 0;
  pcStack_28e0 = (code *)0x10e15e;
  fdb_commit(pfStack_28c8,'\0');
  do {
    pfVar11 = apfStack_28a8[sVar32];
    pcStack_28e0 = (code *)0x10e17c;
    fVar4 = fdb_set_log_callback(pfVar11,logCallbackFunc,"estimate_space_upto_test");
    iVar5 = (int)pfVar11;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_28e0 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar32 = sVar32 + 1;
  } while (sVar16 != sVar32);
  pcStack_28e0 = (code *)0x10e1a0;
  pfVar24 = pfStack_28c8;
  fVar4 = fdb_get_all_snap_markers(pfStack_28c8,&pfStack_28c0,&uStack_28b8);
  iVar5 = (int)pfVar24;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    sVar7 = (size_t)uStack_28ac;
    cVar21 = (char)uStack_28ac;
    uVar13 = uStack_28b8;
    if (cVar21 != '\0') {
      if (uStack_28b8 != 8) {
        pcStack_28e0 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_28e0 = (code *)0x10e1d9;
      sVar16 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[1].marker);
      pcStack_28e0 = (code *)0x10e1ef;
      sVar12 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[2].marker);
      if (sVar12 <= sVar16) {
        pcStack_28e0 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar13 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_28e0 = (code *)0x10e24a;
      fVar4 = fdb_free_snap_markers(pfStack_28c0,uStack_28b8);
      iVar5 = (int)pfStack_28c0;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcStack_28e0 = (code *)0x10e25c;
        fdb_close(pfStack_28c8);
        lVar28 = 0;
        do {
          pcStack_28e0 = (code *)0x10e26b;
          fdb_doc_free(apfStack_2458[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 300);
        pcStack_28e0 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_28e0 = (code *)0x10e281;
        memleak_end();
        pcVar23 = "single kv mode:";
        if (cVar21 != '\0') {
          pcVar23 = "multiple kv mode:";
        }
        pcStack_28e0 = (code *)0x10e2af;
        sprintf(acStack_2858,"estimate space upto marker in file test %s",pcVar23);
        pcVar23 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStack_28e0 = (code *)0x10e2dc;
        fprintf(_stderr,pcVar23,acStack_2858);
        return;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar13 != 4) {
      pcStack_28e0 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_28e0 = (code *)0x10e21c;
    sVar16 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[1].marker);
    pcStack_28e0 = (code *)0x10e232;
    pfVar24 = pfStack_28c8;
    sVar12 = fdb_estimate_space_used_from(pfStack_28c8,pfStack_28c0[2].marker);
    iVar5 = (int)pfVar24;
    if (sVar16 < sVar12) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_28e0 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_28e0 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_28e0 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_28e8 = logCallbackFunc;
  pcStack_28f0 = "estimate_space_upto_test";
  pfStack_2e68 = (fdb_kvs_handle *)0x10e327;
  sStack_2908 = sVar16;
  sStack_2900 = sVar32;
  ppfStack_28f8 = ppfVar33;
  pcStack_28e0 = (code *)sVar7;
  gettimeofday(&tStack_2db0,(__timezone_ptr_t)0x0);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_2e68 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_2e68 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_2a00.buffercache_size = 0;
  fStack_2a00.wal_threshold = 0x400;
  fStack_2a00.flags = 1;
  fStack_2a00.compaction_threshold = '\0';
  fStack_2a00.block_reusing_threshold = 0;
  pfStack_2e68 = (fdb_kvs_handle *)0x10e374;
  fStack_2a00.multi_kv_instances = (bool)(char)iVar5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2e68 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_2e48,"./compact_test1",&fStack_2a00);
  iStack_2e34 = iVar5;
  if (iVar5 == 0) {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_2e48,(fdb_kvs_handle **)(auStack_2e30 + 0x20),
               (fdb_kvs_config *)(auStack_2e30 + 0x48));
    uVar27 = 1;
  }
  else {
    ppfVar18 = (fdb_kvs_handle **)(auStack_2e30 + 0x20);
    uVar15 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_2e30,"kv%d",uVar15 & 0xffffffff);
      pfStack_2e68 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_2e48,ppfVar18,auStack_2e30,(fdb_kvs_config *)(auStack_2e30 + 0x48));
      uVar15 = uVar15 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar15 != 4);
    uVar27 = 4;
  }
  pfVar11 = (fdb_kvs_handle *)(ulong)uVar27;
  uVar15 = 0;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_2da0.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_2da0.config.compaction_minimum_filesize,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_2b00,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_2da0.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e45f;
    sVar7 = strlen((char *)&fStack_2da0.kv_info_offset);
    puVar2 = &fStack_2da0.config.compaction_minimum_filesize;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e472;
    sVar9 = strlen((char *)puVar2);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e482;
    sVar10 = strlen(acStack_2b00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_2da0.kv_info_offset,sVar7,puVar2,sVar9,acStack_2b00,
                   sVar10);
    lVar28 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_2e48,'\x01');
  uVar15 = 5;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_2da0.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_2da0.config.compaction_minimum_filesize;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_2b00,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_2da0.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e549;
    sVar7 = strlen((char *)&fStack_2da0.kv_info_offset);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e554;
    sVar9 = strlen((char *)puVar2);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e55f;
    sVar10 = strlen(acStack_2b00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_2da0.kv_info_offset,sVar7,
                   &fStack_2da0.config.compaction_minimum_filesize,sVar9,acStack_2b00,sVar10);
    lVar28 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_2e48,'\0');
  uVar15 = 10;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_2da0.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_2da0.config.compaction_minimum_filesize;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_2b00,"body%d",uVar15 & 0xffffffff);
    pbVar29 = &fStack_2da0.kvs_config.create_if_missing + uVar15 * 8;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e622;
    sVar7 = strlen((char *)&fStack_2da0.kv_info_offset);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e62d;
    sVar9 = strlen((char *)puVar2);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e638;
    sVar10 = strlen(acStack_2b00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar29,&fStack_2da0.kv_info_offset,sVar7,
                   &fStack_2da0.config.compaction_minimum_filesize,sVar9,acStack_2b00,sVar10);
    lVar28 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar28 * 8 + 0x20),*(fdb_doc **)pbVar29);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0xf);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_2e48,'\x01');
  uVar15 = 0xf;
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_2da0.kv_info_offset,"key%d",uVar15 & 0xffffffff);
    puVar2 = &fStack_2da0.config.compaction_minimum_filesize;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar2,"meta%d",uVar15 & 0xffffffff);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_2b00,"body%d",uVar15 & 0xffffffff);
    pfVar8 = (fdb_kvs_handle *)(&fStack_2da0.kvs_config.create_if_missing + uVar15 * 8);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e6fe;
    sVar7 = strlen((char *)&fStack_2da0.kv_info_offset);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e709;
    pfVar14 = (fdb_kvs_handle *)strlen((char *)puVar2);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e714;
    sVar9 = strlen(acStack_2b00);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)pfVar8,&fStack_2da0.kv_info_offset,sVar7,
                   &fStack_2da0.config.compaction_minimum_filesize,(size_t)pfVar14,acStack_2b00,
                   sVar9);
    lVar28 = 0;
    do {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_2e30 + lVar28 * 8 + 0x20),
              *(fdb_doc **)&pfVar8->kvs_config);
      lVar28 = lVar28 + 1;
    } while (pfVar11 != (fdb_kvs_handle *)lVar28);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x14);
  lVar28 = 0;
  pfStack_2e68 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_2e48,'\0');
  __s = logCallbackFunc;
  pcVar23 = "compact_upto_test";
  do {
    pfStack_2e68 = (fdb_kvs_handle *)0x10e78b;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2e30 + lVar28 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar28 = lVar28 + 1;
  } while (pfVar11 != (fdb_kvs_handle *)lVar28);
  pfStack_2e68 = (fdb_kvs_handle *)0x10e7af;
  fVar4 = fdb_get_all_snap_markers(pfStack_2e48,&pfStack_2e50,(uint64_t *)&pcStack_2e40);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_2e34 == '\0') {
      if (pcStack_2e40 != (char *)0x4) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10e8c9;
        compact_upto_test();
      }
      if (pcStack_2e40 != (char *)0x0) {
        lVar28 = 0x1400000000;
        pfVar14 = (fdb_kvs_handle *)0x0;
        pfVar8 = (fdb_kvs_handle *)0xfffffffb00000000;
        pcVar23 = (char *)0x0;
        do {
          if (*(long *)((long)&pfStack_2e50->num_kvs_markers + (long)pfVar14) != 1) {
            pfStack_2e68 = (fdb_kvs_handle *)0x10eab6;
            compact_upto_test();
          }
          if (*(long *)(*(long *)((long)&pfStack_2e50->kvs_markers + (long)pfVar14) + 8) !=
              lVar28 >> 0x20) {
            pfStack_2e68 = (fdb_kvs_handle *)0x10eac3;
            compact_upto_test();
          }
          pcVar23 = pcVar23 + 1;
          lVar28 = lVar28 + -0x500000000;
          pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 0x18);
        } while (pcVar23 < pcStack_2e40);
      }
      __s = (code *)auStack_2dd0;
      pfStack_2e68 = (fdb_kvs_handle *)0x10e8f3;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_2e68 = (fdb_kvs_handle *)0x10e909;
      fVar4 = fdb_compact_upto(pfStack_2e48,(char *)__s,pfStack_2e50[1].marker);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10e92d;
        fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e30._32_8_,
                                  (fdb_kvs_handle **)(auStack_2e30 + 0x18),
                                  (pfStack_2e50[1].kvs_markers)->seqnum);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10e936;
          compact_upto_test();
          goto LAB_0010e936;
        }
LAB_0010e996:
        __s = (code *)auStack_2dd0;
        pfStack_2e68 = (fdb_kvs_handle *)0x10e9a0;
        fdb_kvs_close((fdb_kvs_handle *)auStack_2e30._24_8_);
        pfStack_2e68 = (fdb_kvs_handle *)0x10e9af;
        fVar4 = fdb_free_snap_markers(pfStack_2e50,(uint64_t)pcStack_2e40);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10e9c1;
          fdb_close(pfStack_2e48);
          lVar28 = 0;
          do {
            pfStack_2e68 = (fdb_kvs_handle *)0x10e9d0;
            fdb_doc_free(*(fdb_doc **)(&fStack_2da0.kvs_config.create_if_missing + lVar28 * 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x14);
          pfStack_2e68 = (fdb_kvs_handle *)0x10e9de;
          fdb_shutdown();
          pfStack_2e68 = (fdb_kvs_handle *)0x10e9e3;
          memleak_end();
          pcVar23 = "single kv mode:";
          if ((char)iStack_2e34 != '\0') {
            pcVar23 = "multiple kv mode:";
          }
          pfStack_2e68 = (fdb_kvs_handle *)0x10ea13;
          sprintf(acStack_2b00,"compact upto marker in file test %s",pcVar23);
          pcVar23 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2e68 = (fdb_kvs_handle *)0x10ea40;
          fprintf(_stderr,pcVar23,acStack_2b00);
          return;
        }
        goto LAB_0010ead9;
      }
      goto LAB_0010eade;
    }
    if (pcStack_2e40 != (char *)0x8) {
      pfStack_2e68 = (fdb_kvs_handle *)0x10e7d7;
      compact_upto_test();
    }
    auStack_2e30._8_8_ = ZEXT48(uVar27 + 1);
    pfVar14 = (fdb_kvs_handle *)auStack_2e30;
    pvVar17 = (void *)0x0;
    do {
      pcVar23 = (char *)((long)pvVar17 * 3);
      if ((fdb_custom_cmp_variable)pfStack_2e50[(long)pvVar17].num_kvs_markers !=
          (fdb_custom_cmp_variable)auStack_2e30._8_8_) {
        pfStack_2e68 = (fdb_kvs_handle *)0x10e8b4;
        compact_upto_test();
      }
      __s = (code *)((long)pvVar17 * -5 + 0x14);
      lVar28 = 8;
      pfVar8 = (fdb_kvs_handle *)0x0;
      auStack_2e30._16_8_ = pvVar17;
      do {
        if (*(code **)(lVar28 + (long)&(pfStack_2e50[(long)pvVar17].kvs_markers)->kv_store_name) !=
            __s) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10e88a;
          compact_upto_test();
        }
        pfStack_2e68 = (fdb_kvs_handle *)0x10e83d;
        sprintf((char *)pfVar14,"kv%d",(ulong)pfVar8 & 0xffffffff);
        psVar3 = *(short **)((long)&pfStack_2e50[(long)pvVar17].kvs_markers[-1].seqnum + lVar28);
        if ((char)psVar3[1] != auStack_2e30[2] || *psVar3 != auStack_2e30._0_2_) {
          pfStack_2e68 = (fdb_kvs_handle *)0x10eacf;
          compact_upto_test();
          goto LAB_0010eacf;
        }
        pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
        lVar28 = lVar28 + 0x10;
      } while (pfVar11 != pfVar8);
      pvVar17 = (void *)(auStack_2e30._16_8_ + 1);
    } while ((fdb_kvs_handle *)pvVar17 != pfVar11);
LAB_0010e936:
    __s = (code *)auStack_2dd0;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e954;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2e68 = (fdb_kvs_handle *)0x10e96a;
    fVar4 = fdb_compact_upto(pfStack_2e48,(char *)__s,pfStack_2e50[1].marker);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
    pfStack_2e68 = (fdb_kvs_handle *)0x10e98e;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2e30._40_8_,
                              (fdb_kvs_handle **)(auStack_2e30 + 0x18),
                              pfStack_2e50[1].kvs_markers[1].seqnum);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
  }
  else {
LAB_0010ead4:
    pfStack_2e68 = (fdb_kvs_handle *)0x10ead9;
    compact_upto_test();
LAB_0010ead9:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eade;
    compact_upto_test();
LAB_0010eade:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eae3;
    compact_upto_test();
LAB_0010eae3:
    pfStack_2e68 = (fdb_kvs_handle *)0x10eae8;
    compact_upto_test();
  }
  pfStack_2e68 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_3360 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_2e90 = __s;
  pfStack_2e88 = pfVar14;
  pfStack_2e80 = pfVar8;
  pcStack_2e78 = pcVar23;
  lStack_2e70 = lVar28;
  pfStack_2e68 = pfVar11;
  gettimeofday((timeval *)(auStack_3308 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_3360 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_3360 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3360 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  pbVar6 = (btree *)auStack_3308;
  pfStack_3360 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_3298[0x110] = '\0';
  auStack_3298[0x111] = '\0';
  auStack_3298[0x112] = '\0';
  auStack_3298[0x113] = '\x01';
  auStack_3298[0x114] = '\0';
  auStack_3298[0x115] = '\0';
  auStack_3298[0x116] = '\0';
  auStack_3298[0x117] = '\0';
  auStack_3298[0x118] = '\0';
  auStack_3298[0x119] = '\x04';
  auStack_3298[0x11a] = '\0';
  auStack_3298[0x11b] = '\0';
  auStack_3298[0x11c] = '\0';
  auStack_3298[0x11d] = '\0';
  auStack_3298[0x11e] = '\0';
  auStack_3298[0x11f] = '\0';
  auStack_3298._300_4_ = 1;
  auStack_3298[0x137] = 0;
  pbVar26 = (btree *)&pfStack_3340;
  pfStack_3360 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",(fdb_config *)(auStack_3298 + 0x108));
  ppfVar18 = &pfStack_3348;
  pfStack_3360 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_3340,ppfVar18,(fdb_kvs_config *)pbVar6);
  pfStack_3360 = (fdb_kvs_handle *)0x10eb93;
  fVar4 = fdb_set_log_callback(pfStack_3348,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_3360 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_3330,"./compact_test1",(fdb_config *)(auStack_3298 + 0x108)
            );
    ppfVar18 = &pfStack_3338;
    pfStack_3360 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3330._0_8_,ppfVar18,(fdb_kvs_config *)auStack_3308);
    pfStack_3360 = (fdb_kvs_handle *)0x10ebe2;
    fVar4 = fdb_set_log_callback(pfStack_3338,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar28 = 0;
    uVar15 = 0;
    do {
      pfStack_3360 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_2f98,"key%d",uVar15 & 0xffffffff);
      pfStack_3360 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_3298 + 0x200,"meta%d",uVar15 & 0xffffffff);
      pfStack_3360 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_3298,"body%d",uVar15 & 0xffffffff);
      pfStack_3360 = (fdb_kvs_handle *)0x10ec4a;
      sVar7 = strlen(acStack_2f98);
      pfStack_3360 = (fdb_kvs_handle *)0x10ec5d;
      sVar9 = strlen(auStack_3298 + 0x200);
      pfStack_3360 = (fdb_kvs_handle *)0x10ec6d;
      sVar10 = strlen(auStack_3298);
      pfStack_3360 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_3330 + lVar28 + 8),acStack_2f98,sVar7,auStack_3298 + 0x200
                     ,sVar9,auStack_3298,sVar10);
      pfStack_3360 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_3348,*(fdb_doc **)(auStack_3330 + uVar15 * 8 + 8));
      uVar15 = uVar15 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar15 == 1);
    pfStack_3360 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_3350,*(void **)(auStack_3330._16_8_ + 0x20),
                   *(size_t *)auStack_3330._16_8_,*(void **)(auStack_3330._16_8_ + 0x38),
                   *(size_t *)(auStack_3330._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_3350->file = true;
    pfStack_3360 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_3348,(fdb_doc *)pfStack_3350);
    pfStack_3360 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_3350);
    pfStack_3360 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_3340,'\x01');
    pfStack_3360 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_3340,"./compact_test2");
    pfStack_3360 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_3360 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_2f98,"key%d",2);
    pbVar26 = (btree *)(auStack_3298 + 0x200);
    pfStack_3360 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)pbVar26,"meta%d",2);
    pfVar14 = (fdb_kvs_handle *)auStack_3298;
    pfStack_3360 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)pfVar14,"body%d",2);
    pfStack_3360 = (fdb_kvs_handle *)0x10ed89;
    pfVar8 = (fdb_kvs_handle *)strlen(acStack_2f98);
    pfStack_3360 = (fdb_kvs_handle *)0x10ed94;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)pbVar26);
    pfStack_3360 = (fdb_kvs_handle *)0x10ed9f;
    sVar7 = strlen((char *)pfVar14);
    pfStack_3360 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_3330 + 0x18),acStack_2f98,(size_t)pfVar8,pbVar26,
                   (size_t)pfVar11,pfVar14,sVar7);
    pfStack_3360 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_3348,(fdb_doc *)auStack_3330._24_8_);
    pfStack_3360 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_3340,'\x01');
    pfStack_3360 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_3348);
    ppfVar18 = &pfStack_3338;
    pfStack_3360 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_3338);
    pfStack_3360 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_3340);
    pbVar6 = (btree *)auStack_3330;
    pfStack_3360 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_3330._0_8_);
    pfStack_3360 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_3360 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)pbVar6,"./compact_test1",(fdb_config *)(auStack_3298 + 0x108));
    pfStack_3360 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3330._0_8_,ppfVar18,(fdb_kvs_config *)auStack_3308);
    pfStack_3360 = (fdb_kvs_handle *)0x10ee4d;
    fVar4 = fdb_set_log_callback(pfStack_3338,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar14 = (fdb_kvs_handle *)0x0;
      ppfVar18 = &pfStack_3350;
      while( true ) {
        pfStack_3360 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_3330 + (long)pfVar14 * 8 + 8))[4],
                       **(size_t **)(auStack_3330 + (long)pfVar14 * 8 + 8),(void *)0x0,0,(void *)0x0
                       ,0);
        pfStack_3360 = (fdb_kvs_handle *)0x10ee90;
        fVar4 = fdb_get(pfStack_3338,(fdb_doc *)pfStack_3350);
        pfVar19 = pfStack_3350;
        if (pfVar14 != (fdb_kvs_handle *)0x1) break;
        pfVar19 = pfVar8;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_3360 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_3350);
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        pfVar8 = pfVar19;
        if (pfVar14 == (fdb_kvs_handle *)0x3) {
          pfStack_3360 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_3330._0_8_,&fStack_32e0);
          pfStack_3360 = (fdb_kvs_handle *)0x10ef28;
          iVar5 = strcmp("./compact_test2",fStack_32e0.filename);
          if (iVar5 != 0) {
            pfStack_3360 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_3360 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_3338);
          pfStack_3360 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_3330._0_8_);
          lVar28 = 0;
          do {
            pfStack_3360 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_3330 + lVar28 * 8 + 8));
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          pfStack_3360 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_3360 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_3360 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar23,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar6 = pfStack_3350->staletree;
        pfVar11 = *(fdb_kvs_handle **)(auStack_3330 + (long)pfVar14 * 8 + 8);
        pbVar26 = pfVar11->staletree;
        pfStack_3360 = (fdb_kvs_handle *)0x10eec9;
        iVar5 = bcmp(pbVar6,pbVar26,(size_t)(pfStack_3350->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar6 = (pfVar19->field_6).seqtree;
          pbVar26 = (pfVar11->field_6).seqtree;
          pfStack_3360 = (fdb_kvs_handle *)0x10eee8;
          iVar5 = bcmp(pbVar6,pbVar26,(size_t)(pfVar19->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010eef0;
          pfStack_3360 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          pfVar8 = pfVar19;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar19 = pfVar8;
        pfStack_3360 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_3360 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      pfVar8 = pfVar19;
LAB_0010efc7:
      pfStack_3360 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_3360 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_3360 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_3360 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_38c8 = (fdb_kvs_handle *)0x10effb;
  ppfStack_3388 = ppfVar18;
  pfStack_3380 = pfVar14;
  pfStack_3378 = pfVar8;
  pbStack_3370 = pbVar6;
  pbStack_3368 = pbVar26;
  pfStack_3360 = pfVar11;
  gettimeofday(&tStack_3838,(__timezone_ptr_t)0x0);
  pfStack_38c8 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_38c8 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_38c8 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_3828;
  pfStack_38c8 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_3480.buffercache_size = 0x1000000;
  fStack_3480.wal_threshold = 0x400;
  fStack_3480.flags = 1;
  fStack_3480.compaction_threshold = '\0';
  ppfVar33 = &pfStack_38a0;
  pfStack_38c8 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar33,"./compact_test1",&fStack_3480);
  ppfVar18 = &pfStack_38a8;
  pfStack_38c8 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_38a0,ppfVar18,config);
  pfStack_38c8 = (fdb_kvs_handle *)0x10f087;
  fVar4 = fdb_set_log_callback(pfStack_38a8,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_38c8 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_3710 + 0x100,"key%d",uVar15 & 0xffffffff);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_3710,"meta%d",uVar15 & 0xffffffff);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_3810,"body%d",uVar15 & 0xffffffff);
      ppfVar33 = (fdb_doc **)((long)apfStack_3890 + (long)pfVar14);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f0ef;
      pfVar8 = (fdb_kvs_handle *)strlen(auStack_3710 + 0x100);
      pfVar11 = (fdb_kvs_handle *)auStack_3710;
      pfStack_38c8 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar11);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f112;
      sVar7 = strlen(acStack_3810);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar33,auStack_3710 + 0x100,(size_t)pfVar8,pfVar11,(size_t)config,
                     acStack_3810,sVar7);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_38a8,apfStack_3890[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar15 != 10);
    pfStack_38c8 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_38a0,'\x01');
    pfStack_38c8 = (fdb_kvs_handle *)0x10f17a;
    fVar4 = fdb_snapshot_open(pfStack_38a8,&pfStack_3898,10);
    ppfVar18 = (fdb_kvs_handle **)0xa;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_38c8 = (fdb_kvs_handle *)0x10f193;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_38a0,"./compact_test2");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_38c8 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_38b0,apfStack_3890[(long)config]->key,
                       apfStack_3890[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_38c8 = (fdb_kvs_handle *)0x10f1d6;
        fVar4 = fdb_get(pfStack_38a8,(fdb_doc *)pfStack_38b0);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_38c8 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_38c8 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_38b0);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_38c8 = (fdb_kvs_handle *)0x10f205;
      iVar5 = stat("./compact_test1",(stat *)(auStack_3710 + 0x200));
      if (iVar5 == 0) {
        pfStack_38c8 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_38c8 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_38b0,apfStack_3890[(long)config]->key,
                       apfStack_3890[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_38c8 = (fdb_kvs_handle *)0x10f249;
        fVar4 = fdb_get(pfStack_3898,(fdb_doc *)pfStack_38b0);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_38c8 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_38b0);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_38c8 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_38a0);
          pfStack_38c8 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar28 = 0;
          do {
            pfStack_38c8 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_3890[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 10);
          pfStack_38c8 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_38c8 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar23,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar18 = &pfStack_38b0;
      pfStack_38c8 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_38c8 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_38c8 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_38c8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_4060 = (fdb_kvs_handle *)0x10f309;
  ppfStack_38f0 = ppfVar18;
  pfStack_38e8 = pfVar14;
  pfStack_38e0 = pfVar8;
  pfStack_38d8 = config;
  ppfStack_38d0 = ppfVar33;
  pfStack_38c8 = pfVar11;
  gettimeofday(&tStack_3fd8,(__timezone_ptr_t)0x0);
  pfStack_4060 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_4060 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_4060 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info_00 = (fdb_kvs_info *)auStack_4020;
  pfStack_4060 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_3dd0.buffercache_size = 0x1000000;
  fStack_3dd0.wal_threshold = 0x400;
  fStack_3dd0.flags = 1;
  fStack_3dd0.compaction_threshold = '\0';
  _Var34._M_i = (__int_type_conflict)(auStack_4038 + 0x10);
  pfStack_4060 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var34._M_i,"./compact_test1",&fStack_3dd0);
  ppfVar18 = (fdb_kvs_handle **)auStack_4038;
  pfStack_4060 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_4038._16_8_,ppfVar18,(char *)0x0,(fdb_kvs_config *)info_00
              );
  pfStack_4060 = (fdb_kvs_handle *)0x10f394;
  pfVar19 = (fdb_kvs_handle *)auStack_4038._0_8_;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_4038._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_4060 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_3cd8 + 0x100,"key%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_3cd8,"meta%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_3fc8,"body%d",uVar15 & 0xffffffff);
      _Var34._M_i = (long)apfStack_3ec8 + (long)pfVar14;
      pfStack_4060 = (fdb_kvs_handle *)0x10f3ff;
      pfVar8 = (fdb_kvs_handle *)strlen(auStack_3cd8 + 0x100);
      pfVar11 = (fdb_kvs_handle *)auStack_3cd8;
      pfStack_4060 = (fdb_kvs_handle *)0x10f412;
      info_00 = (fdb_kvs_info *)strlen((char *)pfVar11);
      pfStack_4060 = (fdb_kvs_handle *)0x10f422;
      sVar7 = strlen(acStack_3fc8);
      pfStack_4060 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var34._M_i,auStack_3cd8 + 0x100,(size_t)pfVar8,pfVar11,
                     (size_t)info_00,acStack_3fc8,sVar7);
      pfStack_4060 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_4038._0_8_,apfStack_3ec8[uVar15]);
      uVar15 = uVar15 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar15 != 0x1e);
    pfStack_4060 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_4038._16_8_,'\0');
    pfStack_4060 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_4038 + 8),"./compact_test1.1",&fStack_3dd0);
    ppfVar18 = (fdb_kvs_handle **)(auStack_4048 + 8);
    pfStack_4060 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_4038._8_8_,ppfVar18,(char *)0x0,
                 (fdb_kvs_config *)auStack_4020);
    pfStack_4060 = (fdb_kvs_handle *)0x10f4bf;
    pfVar19 = (fdb_kvs_handle *)auStack_4048._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4048._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    pfVar14 = (fdb_kvs_handle *)0x0;
    uVar15 = 0;
    do {
      pfStack_4060 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_3cd8 + 0x100,"k2ey%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_3cd8,"m2eta%d",uVar15 & 0xffffffff);
      pfStack_4060 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_3fc8,"b2ody%d",uVar15 & 0xffffffff);
      _Var34._M_i = (__int_type_conflict)(auStack_3cd8 + (long)pfVar14 + 0x200);
      pfStack_4060 = (fdb_kvs_handle *)0x10f52a;
      pfVar8 = (fdb_kvs_handle *)strlen(auStack_3cd8 + 0x100);
      pfVar11 = (fdb_kvs_handle *)auStack_3cd8;
      pfStack_4060 = (fdb_kvs_handle *)0x10f53d;
      info_00 = (fdb_kvs_info *)strlen((char *)pfVar11);
      pfStack_4060 = (fdb_kvs_handle *)0x10f54d;
      sVar7 = strlen(acStack_3fc8);
      pfStack_4060 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var34._M_i,auStack_3cd8 + 0x100,(size_t)pfVar8,pfVar11,
                     (size_t)info_00,acStack_3fc8,sVar7);
      pfStack_4060 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_4048._8_8_,(fdb_doc *)auStack_39e8[uVar15 - 0x1e]);
      uVar15 = uVar15 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar15 != 0x3c);
    pfStack_4060 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_4038._8_8_,'\0');
    pfStack_4060 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_4048._8_8_,(fdb_kvs_info *)(auStack_4020 + 0x18));
    ppfVar18 = apfStack_4000;
    if (apfStack_4000[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_4060 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_4060 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4048._8_8_);
    pfStack_4060 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_4038._8_8_);
    pfStack_4060 = (fdb_kvs_handle *)0x10f5e3;
    pfVar19 = (fdb_kvs_handle *)auStack_4038._16_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_4038._16_8_,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info_00 = (fdb_kvs_info *)auStack_4038;
    pfStack_4060 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4038._0_8_);
    _Var34._M_i = (__int_type_conflict)(auStack_4038 + 0x10);
    pfStack_4060 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_4038._16_8_);
    pfStack_4060 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var34._M_i,"./compact_test1",&fStack_3dd0);
    pfStack_4060 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_4038._16_8_,(fdb_kvs_handle **)info_00,(char *)0x0,
                 (fdb_kvs_config *)auStack_4020);
    pfStack_4060 = (fdb_kvs_handle *)0x10f644;
    pfVar19 = (fdb_kvs_handle *)auStack_4038._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4038._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    pfVar14 = (fdb_kvs_handle *)0x0;
    info_00 = (fdb_kvs_info *)auStack_4048;
    do {
      pfStack_4060 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info_00,
                     (void *)(*(size_t **)((long)apfStack_3ec8 + (long)pfVar14))[4],
                     **(size_t **)((long)apfStack_3ec8 + (long)pfVar14),(void *)0x0,0,(void *)0x0,0)
      ;
      pfStack_4060 = (fdb_kvs_handle *)0x10f68a;
      pfVar19 = (fdb_kvs_handle *)auStack_4038._0_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_4038._0_8_,(fdb_doc *)auStack_4048._0_8_);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var34._M_i = (long)apfStack_3ec8 + (long)pfVar14;
      pfStack_4060 = (fdb_kvs_handle *)0x10f6b6;
      iVar5 = bcmp(*(btree **)(auStack_4048._0_8_ + 0x38),(*(fdb_doc **)_Var34._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_4048._0_8_)->custom_cmp);
      if (iVar5 != 0) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_4060 = (fdb_kvs_handle *)0x10f6d3;
      iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_4048._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var34._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_4048._0_8_)->custom_cmp_param);
      if (iVar5 != 0) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_4060 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_4048._0_8_);
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).custom_cmp;
    } while (pfVar14 != (fdb_kvs_handle *)0xf0);
    pfStack_4060 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_4038 + 8),"./compact_test1.1",&fStack_3dd0);
    info_00 = (fdb_kvs_info *)(auStack_4048 + 8);
    pfStack_4060 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_4038._8_8_,(fdb_kvs_handle **)info_00,(char *)0x0,
                 (fdb_kvs_config *)auStack_4020);
    pfStack_4060 = (fdb_kvs_handle *)0x10f757;
    pfVar19 = (fdb_kvs_handle *)auStack_4048._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4048._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      info_00 = (fdb_kvs_info *)(auStack_4020 + 0x18);
      pfStack_4060 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_4048._8_8_,info_00);
      if (apfStack_4000[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var34._M_i = 0;
      ppfVar18 = (fdb_kvs_handle **)auStack_4048;
      while( true ) {
        pfStack_4060 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar18,
                       (void *)(*(size_t **)(auStack_3cd8 + 0x200 + _Var34._M_i))[4],
                       **(size_t **)(auStack_3cd8 + 0x200 + _Var34._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_4060 = (fdb_kvs_handle *)0x10f7be;
        pfVar19 = (fdb_kvs_handle *)auStack_4048._8_8_;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_4048._8_8_,(fdb_doc *)auStack_4048._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        info_00 = (fdb_kvs_info *)(auStack_3cd8 + 0x200 + _Var34._M_i);
        pfStack_4060 = (fdb_kvs_handle *)0x10f7ea;
        iVar5 = bcmp(*(btree **)(auStack_4048._0_8_ + 0x38),*(void **)(info_00->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_4048._0_8_)->custom_cmp);
        if (iVar5 != 0) {
          pfStack_4060 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_4060 = (fdb_kvs_handle *)0x10f807;
        iVar5 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_4048._0_8_ + 0x40))
                     ->seqtree,*(void **)(info_00->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_4048._0_8_)->custom_cmp_param);
        if (iVar5 != 0) {
          pfStack_4060 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_4060 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_4048._0_8_);
        _Var34._M_i = _Var34._M_i + 8;
        if ((fdb_doc **)_Var34._M_i == (fdb_doc **)0x1e0) {
          lVar28 = 0;
          do {
            pfStack_4060 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_3ec8[lVar28]);
            pfStack_4060 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_39e8[lVar28 + -0x1e]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x1e);
          lVar28 = 0;
          do {
            pfStack_4060 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_39e8[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x1e);
          pfStack_4060 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4038._0_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_4038._16_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4048._8_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_4038._8_8_);
          pfStack_4060 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_4060 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_4060 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar23,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_4060 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_4060 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_4060 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_4060 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_4060 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_4060 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_4838 = (fdb_kvs_handle *)0x10f937;
  ppfStack_4088 = ppfVar18;
  pfStack_4080 = pfVar14;
  pfStack_4078 = pfVar8;
  pfStack_4070 = info_00;
  ppfStack_4068 = (fdb_doc **)_Var34._M_i;
  pfStack_4060 = pfVar11;
  gettimeofday(&tStack_47b8,(__timezone_ptr_t)0x0);
  pfStack_4838 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_4838 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar22 = (fdb_kvs_handle *)auStack_47a8;
  pfStack_4838 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_47a8._8_8_ = (list *)0x0;
  auStack_47a8._16_8_ = (list *)0x400;
  auStack_47a8[0x2f] = '\0';
  if (pfVar19 == (fdb_kvs_handle *)0x0) {
    pfStack_4838 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4820;
    pfStack_4838 = (fdb_kvs_handle *)0x10f999;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_47a8);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4838 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_4820;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4820,&pfStack_4818,&fStack_4800);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar28 = 0;
      uVar15 = 0;
      do {
        pfStack_4838 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_44b0,"key%d",uVar15 & 0xffffffff);
        pfStack_4838 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_47a8 + 0x1f8,"meta%d",uVar15 & 0xffffffff);
        pfStack_4838 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_47a8 + 0xf8,"body%d",uVar15 & 0xffffffff);
        pfStack_4838 = (fdb_kvs_handle *)0x10fa20;
        pfVar8 = (fdb_kvs_handle *)strlen(acStack_44b0);
        pfVar11 = (fdb_kvs_handle *)(auStack_47a8 + 0x1f8);
        pfStack_4838 = (fdb_kvs_handle *)0x10fa33;
        sVar7 = strlen((char *)pfVar11);
        pfStack_4838 = (fdb_kvs_handle *)0x10fa43;
        sVar9 = strlen(auStack_47a8 + 0xf8);
        pfStack_4838 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_43b0 + lVar28),acStack_44b0,(size_t)pfVar8,
                       pfVar11,sVar7,auStack_47a8 + 0xf8,sVar9);
        pfStack_4838 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_4818,apfStack_43b0[uVar15]);
        uVar15 = uVar15 + 1;
        lVar28 = lVar28 + 8;
      } while (uVar15 != 100);
      pfStack_4838 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_4820,'\0');
      pfStack_4838 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_4818,(fdb_kvs_info *)auStack_47e8);
      pfVar19 = (fdb_kvs_handle *)(auStack_47e8 + 0x10);
      if ((filemgr *)auStack_47e8._16_8_ != (filemgr *)0x64) {
        pfStack_4838 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar28 = 0;
      _Var34._M_i = (__int_type_conflict)&pfStack_4810;
      do {
        pfStack_4838 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_4818,apfStack_43b0[lVar28]);
        if (lVar28 == 0x32) {
          pfStack_4838 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var34._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_4820);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      pfStack_4838 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_4810,&pvStack_4808);
      pfStack_4838 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_4820,'\x01');
      pfStack_4838 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_4818,(fdb_kvs_info *)auStack_47e8);
      if ((filemgr *)auStack_47e8._16_8_ != (filemgr *)0x0) {
        pfStack_4838 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_4838 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_4818);
      pfVar22 = (fdb_kvs_handle *)&pfStack_4820;
      pfStack_4838 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_4820);
      pfStack_4838 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar22;
      fVar4 = fdb_open((fdb_file_handle **)pfVar22,"./compact_test1",(fdb_config *)auStack_47a8);
      pfVar14 = (fdb_kvs_handle *)0x64;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_4838 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_4820;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4820,&pfStack_4818,&fStack_4800);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_4838 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_4818,(fdb_kvs_info *)auStack_47e8);
        if ((filemgr *)auStack_47e8._16_8_ != (filemgr *)0x0) {
          pfStack_4838 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar28 = 0;
        do {
          pfStack_4838 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_43b0[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 100);
        pfStack_4838 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_4818);
        pfStack_4838 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_4820);
        pfStack_4838 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_4838 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pfStack_4838 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar23,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_4838 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_4838 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_4838 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_4838 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_4838 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4820;
    pfStack_4838 = (fdb_kvs_handle *)0x10fc41;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_47a8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_4838 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_4820;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_4820,(char *)0x0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_4838 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_4820);
      pfStack_4838 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_4838 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar20 = (char *)0x0;
  pfStack_185f0 = (fdb_kvs_handle *)0x10fcab;
  pfStack_185a8 = ptr_fhandle;
  pfStack_4860 = pfVar19;
  pfStack_4858 = pfVar14;
  pfStack_4850 = pfVar8;
  pfStack_4848 = pfVar22;
  ppfStack_4840 = (fdb_doc **)_Var34._M_i;
  pfStack_4838 = pfVar11;
  gettimeofday(&tStack_18440,(__timezone_ptr_t)0x0);
  pfStack_185f0 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_185f0 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar19 = (fdb_kvs_handle *)auStack_18548;
  pfStack_185f0 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_185f0 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_18548._8_8_ = (kvs_ops_stat *)0x0;
  auStack_18548._16_8_ = (fdb_file_handle *)0x400;
  auStack_18548._36_4_ = 1;
  auStack_18548._46_2_ = 0x1e01;
  auStack_18548._56_8_ = (docio_handle *)0x1;
  auStack_18548._120_8_ = 0;
  pcVar23 = auStack_185d8;
  pfStack_185f0 = (fdb_kvs_handle *)0x10fd11;
  fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)pfVar19);
  if (fVar4 == FDB_RESULT_INVALID_CONFIG) {
    auStack_18548._120_8_ = 4;
    pfStack_185f0 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_185d8,"compact_test",(fdb_config *)auStack_18548);
    pfVar19 = (fdb_kvs_handle *)(auStack_185d8 + 8);
    pfStack_185f0 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_185d8._0_8_,(fdb_kvs_handle **)pfVar19,&fStack_185a0);
    pfStack_185f0 = (fdb_kvs_handle *)0x10fd69;
    pcVar23 = (char *)auStack_185d8._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185d8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_185f0 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar20 = (char *)0x0;
    uVar15 = 0;
    do {
      pfStack_185f0 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_183e8,"key%04d",uVar15 & 0xffffffff);
      pfStack_185f0 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_182e8,"meta%04d",uVar15 & 0xffffffff);
      pfStack_185f0 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_181e8,"body%04d",uVar15 & 0xffffffff);
      pfVar11 = (fdb_kvs_handle *)(&afStack_180e8[0].kvs_config.create_if_missing + (long)pcVar20);
      pfStack_185f0 = (fdb_kvs_handle *)0x10fde9;
      sVar7 = strlen((char *)apfStack_183e8);
      _Var34._M_i = sVar7 + 1;
      pfStack_185f0 = (fdb_kvs_handle *)0x10fdf5;
      sVar7 = strlen(acStack_182e8);
      pfVar8 = (fdb_kvs_handle *)(sVar7 + 1);
      pfStack_185f0 = (fdb_kvs_handle *)0x10fe01;
      sVar7 = strlen(acStack_181e8);
      pfStack_185f0 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar11,apfStack_183e8,_Var34._M_i,acStack_182e8,(size_t)pfVar8,
                     acStack_181e8,sVar7 + 1);
      pfStack_185f0 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_185d8._8_8_,
              *(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + uVar15 * 8));
      uVar15 = uVar15 + 1;
      pcVar20 = (char *)((long)pcVar20 + 8);
    } while (uVar15 != 10000);
    pfVar19 = (fdb_kvs_handle *)auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_185d8._0_8_,'\0');
    pfStack_185f0 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_185d8._0_8_);
    pfStack_185f0 = (fdb_kvs_handle *)0x10fe7d;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_18548);
    pfVar14 = (fdb_kvs_handle *)0x2710;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_185f0 = (fdb_kvs_handle *)0x10fe99;
    pcVar23 = (char *)auStack_185d8._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d8._0_8_,(fdb_kvs_handle **)(auStack_185d8 + 8)
                       ,&fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_185f0 = (fdb_kvs_handle *)0x10feb9;
    pcVar23 = (char *)auStack_185d8._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185d8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar19 = (fdb_kvs_handle *)&_Stack_18430;
    pfStack_185f0 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_185d8._0_8_,(fdb_file_info *)pfVar19);
    pfStack_185f0 = (fdb_kvs_handle *)0x10fee5;
    iVar5 = strcmp((char *)_Stack_18430._M_i,"compact_test");
    if (iVar5 != 0) {
      pfStack_185f0 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar20 = "key%04d";
    _Var34._M_i = (__int_type_conflict)apfStack_183e8;
    pfVar8 = (fdb_kvs_handle *)0x0;
    pfVar22 = pfVar11;
    do {
      pfStack_185f0 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var34._M_i,"key%04d",(ulong)pfVar8 & 0xffffffff);
      pfStack_185f0 = (fdb_kvs_handle *)0x10ff20;
      sVar7 = strlen((char *)_Var34._M_i);
      pfStack_185f0 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_185c0,(void *)_Var34._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_185f0 = (fdb_kvs_handle *)0x10ff50;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_185d8._8_8_,(fdb_doc *)pfStack_185c0);
      pfVar11 = pfStack_185c0;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_185f0 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar19 = (fdb_kvs_handle *)(pfStack_185c0->field_6).seqtree;
      pfVar14 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_180e8[0].kvs_config.create_if_missing + (long)pfVar8 * 8) +
                 0x40);
      pfStack_185f0 = (fdb_kvs_handle *)0x10ff7c;
      iVar5 = bcmp(pfVar19,pfVar14,(size_t)(pfStack_185c0->kvs_config).custom_cmp_param);
      pfVar22 = pfVar11;
      if (iVar5 != 0) {
        pfStack_185f0 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_185f0 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
    } while (pfVar8 != (fdb_kvs_handle *)0x2710);
    pfStack_185f0 = (fdb_kvs_handle *)0x10ffb0;
    pcVar23 = (char *)auStack_185d8._8_8_;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_185d8._8_8_,
                              (fdb_kvs_handle **)&pfStack_18580,10000);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_185f0 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_18580);
    pfVar19 = (fdb_kvs_handle *)auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_185d8._0_8_);
    pfStack_185f0 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_185f0 = (fdb_kvs_handle *)0x10fff2;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_185f0 = (fdb_kvs_handle *)0x11000e;
    pcVar23 = (char *)auStack_185d8._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d8._0_8_,(fdb_kvs_handle **)(auStack_185d8 + 8)
                       ,&fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_185f0 = (fdb_kvs_handle *)0x11002e;
    pcVar23 = (char *)auStack_185d8._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185d8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar20 = "key%04d";
    _Var34._M_i = (__int_type_conflict)apfStack_183e8;
    pfVar8 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_185f0 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var34._M_i,"key%04d",(ulong)pfVar8 & 0xffffffff);
      pfStack_185f0 = (fdb_kvs_handle *)0x110060;
      sVar7 = strlen((char *)_Var34._M_i);
      pfStack_185f0 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_185c0,(void *)_Var34._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_185f0 = (fdb_kvs_handle *)0x110090;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_185d8._8_8_,(fdb_doc *)pfStack_185c0);
      pfVar22 = pfStack_185c0;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar19 = (fdb_kvs_handle *)(pfStack_185c0->field_6).seqtree;
      pfVar14 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_180e8[0].kvs_config.create_if_missing + (long)pfVar8 * 8) +
                 0x40);
      pfStack_185f0 = (fdb_kvs_handle *)0x1100bc;
      iVar5 = bcmp(pfVar19,pfVar14,(size_t)(pfStack_185c0->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001107eb;
      pfStack_185f0 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
      pfVar11 = pfVar22;
    } while (pfVar8 != (fdb_kvs_handle *)0x2710);
    pfVar19 = (fdb_kvs_handle *)auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_185d8._0_8_);
    pfStack_185f0 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_185f0 = (fdb_kvs_handle *)0x11010c;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_185f0 = (fdb_kvs_handle *)0x110128;
    pcVar23 = (char *)auStack_185d8._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d8._0_8_,(fdb_kvs_handle **)(auStack_185d8 + 8)
                       ,&fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_185f0 = (fdb_kvs_handle *)0x110148;
    pcVar23 = (char *)auStack_185d8._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185d8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar20 = "key%04d";
    _Var34._M_i = (__int_type_conflict)apfStack_183e8;
    pfVar8 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_185f0 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var34._M_i,"key%04d",(ulong)pfVar8 & 0xffffffff);
      pfStack_185f0 = (fdb_kvs_handle *)0x11017a;
      sVar7 = strlen((char *)_Var34._M_i);
      pfStack_185f0 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_185c0,(void *)_Var34._M_i,sVar7 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_185f0 = (fdb_kvs_handle *)0x1101aa;
      pcVar23 = (char *)auStack_185d8._8_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_185d8._8_8_,(fdb_doc *)pfStack_185c0);
      pfVar22 = pfStack_185c0;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar19 = (fdb_kvs_handle *)(pfStack_185c0->field_6).seqtree;
      pfVar14 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_180e8[0].kvs_config.create_if_missing + (long)pfVar8 * 8) +
                 0x40);
      pfStack_185f0 = (fdb_kvs_handle *)0x1101d6;
      iVar5 = bcmp(pfVar19,pfVar14,(size_t)(pfStack_185c0->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_001107fb;
      pfStack_185f0 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
      pfVar11 = pfVar22;
    } while (pfVar8 != (fdb_kvs_handle *)0x2710);
    pfStack_185f0 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_185d8._0_8_);
    pcVar23 = (char *)&pfStack_185b0;
    pfStack_185f0 = (fdb_kvs_handle *)0x110219;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_less",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_185f0 = (fdb_kvs_handle *)0x110238;
    pcVar23 = (char *)pfStack_185b0;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_185b0,(fdb_kvs_handle **)&pfStack_18568,
                       &fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_18548._46_2_ = auStack_18548._46_2_ & 0xff;
    pcVar23 = (char *)&pfStack_185b8;
    pfStack_185f0 = (fdb_kvs_handle *)0x11025d;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_185f0 = (fdb_kvs_handle *)0x110279;
    pcVar23 = (char *)pfStack_185b8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_185b8,(fdb_kvs_handle **)&aStack_18570.seqtree,
                       &fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_18548._46_2_ = auStack_18548._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_185c8;
    pfStack_185f0 = (fdb_kvs_handle *)0x11029e;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_185f0 = (fdb_kvs_handle *)0x1102ba;
    pcVar23 = (char *)pfStack_185c8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_185c8,(fdb_kvs_handle **)&aStack_18578.seqtree,
                       &fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_18548._46_2_ = 0x1e01;
    pcVar23 = auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x1102e1;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_185f0 = (fdb_kvs_handle *)0x1102fd;
    pcVar23 = (char *)auStack_185d8._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_185d8._0_8_,(fdb_kvs_handle **)(auStack_185d8 + 8)
                       ,&fStack_185a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_185f0 = (fdb_kvs_handle *)0x11031d;
    pcVar23 = (char *)auStack_185d8._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_185d8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar20 = (char *)0x0;
    pfStack_185f0 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_185f0 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_18548 + 0xf8),(__timezone_ptr_t)0x0);
    tVar36.tv_usec = _Stack_18448._M_i;
    tVar36.tv_sec = auStack_18548._248_8_;
    do {
      pfVar22 = (fdb_kvs_handle *)0xfffffffffffec780;
      pfVar8 = (fdb_kvs_handle *)0x0;
      iVar5 = 0;
      aStack_18588 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
      do {
        pfStack_185f0 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_185d8._8_8_,*(fdb_doc **)(acStack_4868 + (long)pfVar22));
        pfStack_185f0 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_185d8._0_8_,'\0');
        uVar27 = (int)((ulong)pfVar8 / 100) * 100 + iVar5;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar27;
        if (uVar27 == 0) {
          pfStack_185f0 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_18568,*(fdb_doc **)(acStack_4868 + (long)pfVar22));
          pfStack_185f0 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_185b0,'\0');
        }
        pfStack_185f0 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_18570.seqtree,*(fdb_doc **)(acStack_4868 + (long)pfVar22));
        pfStack_185f0 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_185b8,'\0');
        pfStack_185f0 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_18578.seqtree,*(fdb_doc **)(acStack_4868 + (long)pfVar22));
        pfStack_185f0 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_185c8,'\0');
        pfStack_185f0 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_18558,(__timezone_ptr_t)0x0);
        pfStack_185f0 = (fdb_kvs_handle *)0x110420;
        tVar35 = _utime_gap(tVar36,tStack_18558);
        if (pfStack_185a8 <= (fdb_kvs_handle *)tVar35.tv_sec) {
          pcVar20 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar5 = iVar5 + -1;
        pfVar8 = (fdb_kvs_handle *)(ulong)((int)pfVar8 + 1);
        pfVar22 = (fdb_kvs_handle *)&(pfVar22->kvs_config).custom_cmp;
        pcVar20 = (char *)aStack_18588;
      } while (pfVar22 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar20 == 0);
    pfStack_185f0 = (fdb_kvs_handle *)0x110459;
    pcVar23 = (char *)auStack_185d8._0_8_;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_185d8._0_8_,0x3c);
    pfVar19 = (fdb_kvs_handle *)auStack_18548._248_8_;
    _Var34._M_i = _Stack_18448._M_i;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_185f0 = (fdb_kvs_handle *)0x110470;
    pcVar23 = (char *)auStack_185d8._0_8_;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_185d8._0_8_,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_185f0 = (fdb_kvs_handle *)0x110484;
    pcVar23 = (char *)pfStack_185b8;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_185b8,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_185f0 = (fdb_kvs_handle *)0x11049d;
    pcVar23 = (char *)pfStack_185c8;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_185c8,"compact_test_manual_compacted");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_18548._46_2_ = auStack_18548._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_18560;
    pfStack_185f0 = (fdb_kvs_handle *)0x1104c5;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_185f0 = (fdb_kvs_handle *)0x1104e1;
    pcVar23 = (char *)pfStack_185c8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_185c8,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_185f0 = (fdb_kvs_handle *)0x1104f7;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18560);
    pcVar23 = (char *)pfStack_18560;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_185f0 = (fdb_kvs_handle *)0x110513;
    pcVar23 = (char *)pfStack_185c8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_185c8,'\x01',10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_185f0 = (fdb_kvs_handle *)0x11052f;
    pcVar23 = (char *)pfStack_185c8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_185c8,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_185f0 = (fdb_kvs_handle *)0x110541;
    pcVar23 = (char *)pfStack_185c8;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_185c8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_18548[0x2e] = 1;
    pcVar23 = (char *)&pfStack_185c8;
    pfStack_185f0 = (fdb_kvs_handle *)0x110566;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_185f0 = (fdb_kvs_handle *)0x11057c;
    pcVar23 = (char *)pfStack_185b8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_185b8,'\0',0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_185f0 = (fdb_kvs_handle *)0x11058e;
    pcVar23 = (char *)pfStack_185b8;
    fVar4 = fdb_close((fdb_file_handle *)pfStack_185b8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_18548._46_2_ = auStack_18548._46_2_ & 0xff00;
    pcVar23 = (char *)&pfStack_185b8;
    pfStack_185f0 = (fdb_kvs_handle *)0x1105b3;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar20 = "compact_test_non.manual";
    pfStack_185f0 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_185b8,"compact_test_non.manual");
    pfVar19 = (fdb_kvs_handle *)auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_185d8._0_8_);
    pfStack_185f0 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_185b0);
    pfStack_185f0 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_185c8);
    auStack_18548[0x2e] = 1;
    pfStack_185f0 = (fdb_kvs_handle *)0x110607;
    pcVar23 = (char *)pfVar19;
    fVar4 = fdb_open((fdb_file_handle **)pfVar19,"compact_test_non.manual",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar23 = "compact_test_non.manual";
    pfStack_185f0 = (fdb_kvs_handle *)0x110624;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_18548._46_2_ = auStack_18548._46_2_ & 0xff00;
    pcVar23 = auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x11064a;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar23 = "compact_test_manual_compacted";
    pfStack_185f0 = (fdb_kvs_handle *)0x110667;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_18548[0x2e] = 1;
    pcVar23 = "compact_test_manual_compacted";
    pfStack_185f0 = (fdb_kvs_handle *)0x110688;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_18548._46_2_ = auStack_18548._46_2_ & 0xff00;
    pcVar23 = "compact_test_non.manual";
    pfStack_185f0 = (fdb_kvs_handle *)0x1106a8;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_185f0 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_185b8);
    pfStack_185f0 = (fdb_kvs_handle *)0x1106c0;
    fVar4 = fdb_shutdown();
    pcVar23 = (char *)pfStack_185b8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar23 = "compact_test_non.manual";
    pfStack_185f0 = (fdb_kvs_handle *)0x1106dc;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_18548._36_4_ = 2;
    pcVar23 = auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x110704;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar23 = auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x110726;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar23 = auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x110748;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non",(fdb_config *)auStack_18548);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar23 = auStack_185d8;
    pfStack_185f0 = (fdb_kvs_handle *)0x11076a;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test_non.manual",
                     (fdb_config *)auStack_18548);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      lVar28 = 0;
      do {
        pfStack_185f0 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_180e8[0].kvs_config.create_if_missing + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10000);
      pfStack_185f0 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_185f0 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_185f0 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar23,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_185f0 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_185f0 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_185f0 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_185f0 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_185f0 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_185f0 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_185f0 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_185f0 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar22 = pfVar11;
LAB_00110833:
    pfStack_185f0 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_185f0 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_185f0 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_185f0 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_185f0 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_185f0 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_185f0 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_185f0 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_185f0 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_185f0 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_185f0 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_185f0 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_185f0 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_185f0 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_185f0 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_185f0 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_185f0 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_185f0 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_185f0 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_185f0 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_185f0 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_185f0 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_185f0 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_18788 = (fdb_kvs_handle *)0x110916;
  aStack_18618 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar20;
  pfStack_18610 = pfVar14;
  pfStack_18608 = pfVar8;
  pfStack_18600 = pfVar19;
  ppfStack_185f8 = (fdb_doc **)_Var34._M_i;
  pfStack_185f0 = pfVar22;
  gettimeofday(&tStack_18738,(__timezone_ptr_t)0x0);
  pfStack_18788 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_18788 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18788 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_186e2 = 1;
  uStack_186d8._0_2_ = 1;
  uStack_186d8._2_2_ = 0;
  uStack_186d8._4_4_ = 0;
  pfStack_18788 = (fdb_kvs_handle *)0x110955;
  fVar4 = fdb_open(&pfStack_18778,"compact_test",(fdb_config *)(auStack_18728 + 0x18));
  pfVar30 = (fdb_config *)(auStack_18728 + 0x18);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar30 = (fdb_config *)auStack_18728;
    pfStack_18788 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_18788 = (fdb_kvs_handle *)0x11097c;
    fVar4 = fdb_kvs_open_default(pfStack_18778,&pfStack_18770,(fdb_kvs_config *)pfVar30);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_18788 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_18748,(__timezone_ptr_t)0x0);
    pfStack_18788 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar23 & 0xffffffff);
    tVar35.tv_usec = tStack_18748.tv_usec;
    tVar35.tv_sec = tStack_18748.tv_sec;
    pfVar8 = (fdb_kvs_handle *)((long)&atStack_18768[1].tv_sec + 1);
    pfVar22 = (fdb_kvs_handle *)0x0;
    do {
      iVar5 = (int)pfVar22;
      pfStack_18788 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)pfVar8,"%d",pfVar22);
      pfVar14 = pfStack_18770;
      pfStack_18788 = (fdb_kvs_handle *)0x1109d1;
      sVar7 = strlen((char *)pfVar8);
      pfStack_18788 = (fdb_kvs_handle *)0x1109ec;
      fVar4 = fdb_set_kv(pfVar14,pfVar8,sVar7,"value",5);
      pfVar30 = (fdb_config *)tStack_18748.tv_sec;
      _Var34._M_i = tStack_18748.tv_usec;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_18788 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_18788 = (fdb_kvs_handle *)0x110a00;
      fVar4 = fdb_commit(pfStack_18778,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_18788 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_18788 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_18768,(__timezone_ptr_t)0x0);
      pfStack_18788 = (fdb_kvs_handle *)0x110a29;
      tVar36 = _utime_gap(tVar35,atStack_18768[0]);
    } while (((fdb_kvs_handle *)tVar36.tv_sec < pcVar23) &&
            (pfVar22 = (fdb_kvs_handle *)(ulong)(iVar5 + 1), iVar5 != 99999));
    pfStack_18788 = (fdb_kvs_handle *)0x110a49;
    fVar4 = fdb_close(pfStack_18778);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_18788 = (fdb_kvs_handle *)0x110a52;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_18788 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_18788 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar23,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_18788 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_18788 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_18788 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_18788 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_187b0 = (fdb_kvs_handle *)pcVar23;
  pfStack_187a8 = pfVar14;
  pfStack_187a0 = pfVar8;
  pfStack_18798 = pfVar30;
  ppfStack_18790 = (fdb_doc **)_Var34._M_i;
  pfStack_18788 = pfVar22;
  gettimeofday(&tStack_18ab8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18b28._32_8_ = (btree *)0x0;
  auStack_18b28._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_188a8.wal_threshold = 0x1000;
  fStack_188a8.compaction_mode = '\x01';
  fStack_188a8.compaction_threshold = '\n';
  fStack_188a8.compactor_sleep_duration = 1;
  info_01 = (fdb_file_info *)0x14e0c5;
  pfVar11 = (fdb_kvs_handle *)&pfStack_18b48;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar4 = fdb_open_custom_cmp((fdb_file_handle **)pfVar11,"compact_test",&fStack_188a8,1,
                              (char **)(auStack_18b28 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18b28 + 0x18),(void **)0x0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18b28._16_8_ = afStack_18aa8[0].doc_count;
    auStack_18b28._0_8_ = afStack_18aa8[0].filename;
    auStack_18b28._8_8_ = afStack_18aa8[0].new_filename;
    info_01 = (fdb_file_info *)auStack_18b40;
    pfVar11 = pfStack_18b48;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18b48,(fdb_kvs_handle **)info_01,
                       (fdb_kvs_config *)auStack_18b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_01 = (fdb_file_info *)auStack_18b30;
    kvs_config_00 = (fdb_file_info *)auStack_18b28;
    pfVar11 = pfStack_18b48;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18b48,(fdb_kvs_handle **)info_01,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar15 = 0;
    do {
      sprintf((char *)afStack_18aa8,"key%06d",uVar15);
      sprintf((char *)afStack_189a8,"body%06d",uVar15);
      pfVar11 = (fdb_kvs_handle *)auStack_18b40._0_8_;
      sVar7 = strlen((char *)afStack_18aa8);
      sVar9 = strlen((char *)afStack_189a8);
      kvs_config_00 = afStack_189a8;
      info_01 = afStack_18aa8;
      fVar4 = fdb_set_kv(pfVar11,afStack_18aa8,sVar7,afStack_189a8,sVar9);
      handle = auStack_18b30;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar7 = strlen((char *)afStack_18aa8);
      sVar9 = strlen((char *)afStack_189a8);
      kvs_config_00 = afStack_189a8;
      info_01 = afStack_18aa8;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_18aa8,sVar7,afStack_189a8,sVar9);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar11 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar27 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar27;
    } while (uVar27 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_18b28;
    auStack_18b28._8_8_ = _compact_test_keycmp;
    info_01 = (fdb_file_info *)(auStack_18b40 + 8);
    pfVar11 = pfStack_18b48;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18b48,(fdb_kvs_handle **)info_01,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_01 = afStack_18aa8;
    sprintf((char *)info_01,"key%06d",0);
    kvs_config_00 = afStack_189a8;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar7 = strlen((char *)info_01);
    sVar9 = strlen((char *)kvs_config_00);
    fVar4 = fdb_set_kv((fdb_kvs_handle *)auStack_18b40._8_8_,info_01,sVar7,kvs_config_00,sVar9);
    pfVar11 = (fdb_kvs_handle *)auStack_18b40._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_01 = (fdb_file_info *)0x0;
    pfVar11 = pfStack_18b48;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18b48,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar15 = 0;
    uVar31 = 0;
    do {
      sprintf((char *)afStack_18aa8,"key%06d",uVar31);
      sprintf((char *)afStack_189a8,"body%06d",uVar31);
      pfVar11 = (fdb_kvs_handle *)auStack_18b40._0_8_;
      sVar7 = strlen((char *)afStack_18aa8);
      sVar9 = strlen((char *)afStack_189a8);
      kvs_config_00 = afStack_189a8;
      info_01 = afStack_18aa8;
      fVar4 = fdb_set_kv(pfVar11,afStack_18aa8,sVar7,afStack_189a8,sVar9);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_01 = (fdb_file_info *)(auStack_18b28 + 0x28);
      pfVar11 = pfStack_18b48;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b48,info_01);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar15 < uStack_18ad8) {
        uVar15 = uStack_18ad8;
      }
      uVar27 = (int)uVar31 + 1;
      uVar31 = (ulong)uVar27;
    } while (uVar27 != 10000);
    info_01 = (fdb_file_info *)0x0;
    pfVar11 = pfStack_18b48;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18b48,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_01 = (fdb_file_info *)(auStack_18b28 + 0x28);
    pfVar11 = pfStack_18b48;
    fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b48,info_01);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar15 < uStack_18ad8) {
      uVar15 = uStack_18ad8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar15);
    do {
      sleep(1);
      info_01 = (fdb_file_info *)(auStack_18b28 + 0x28);
      pfVar11 = pfStack_18b48;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18b48,
                                (fdb_file_info *)(auStack_18b28 + 0x28));
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar15 <= uStack_18ad8);
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18b48);
    pfVar11 = pfStack_18b48;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      pfVar11 = pfStack_18b48;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar23,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_01 == kvs_config_00) {
    memcmp(pfVar11,__s2,(size_t)info_01);
    return;
  }
  if (info_01 < kvs_config_00) {
    kvs_config_00 = info_01;
  }
  memcmp(pfVar11,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void compact_wo_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction without reopen test");
}